

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersector1<8>::
     occluded_t<embree::avx512::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  float fVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int iVar17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  byte bVar60;
  byte bVar61;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  uint uVar62;
  byte bVar63;
  byte bVar64;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  ulong uVar65;
  undefined8 in_R11;
  byte bVar66;
  bool bVar67;
  undefined1 uVar68;
  undefined1 uVar69;
  ulong uVar70;
  uint uVar71;
  uint uVar120;
  uint uVar121;
  uint uVar123;
  uint uVar124;
  uint uVar125;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  uint uVar122;
  uint uVar126;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float pp;
  float fVar127;
  undefined4 uVar128;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar129 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar141;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  float fVar157;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [64];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar212 [32];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar213 [64];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar218 [64];
  undefined1 auVar219 [16];
  undefined1 auVar220 [28];
  undefined1 auVar221 [64];
  undefined1 auVar222 [32];
  undefined1 auVar223 [64];
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [64];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloatx_conflict vu0;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_928;
  int local_914;
  ulong local_910;
  ulong local_908;
  undefined1 local_900 [32];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  undefined1 auStack_8d0 [16];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [16];
  uint local_728;
  uint local_724;
  undefined1 local_720 [32];
  RTCFilterFunctionNArguments local_6f0;
  undefined1 local_6c0 [32];
  float local_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined8 local_680;
  undefined4 local_678;
  float local_674;
  undefined4 local_670;
  undefined4 local_66c;
  undefined4 local_668;
  uint local_664;
  uint local_660;
  Primitive *local_650;
  ulong local_648;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  ulong local_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar110 [32];
  
  uVar65 = (ulong)(byte)prim[1];
  fVar141 = *(float *)(prim + uVar65 * 0x19 + 0x12);
  auVar79 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar65 * 0x19 + 6));
  fVar157 = fVar141 * auVar79._0_4_;
  fVar127 = fVar141 * (ray->dir).field_0.m128[0];
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar65 * 4 + 6);
  auVar85 = vpmovsxbd_avx2(auVar74);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar65 * 5 + 6);
  auVar84 = vpmovsxbd_avx2(auVar75);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar65 * 6 + 6);
  auVar86 = vpmovsxbd_avx2(auVar77);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar65 * 0xb + 6);
  auVar87 = vpmovsxbd_avx2(auVar76);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar65 * 0xc + 6);
  auVar88 = vpmovsxbd_avx2(auVar72);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar65 * 0xd + 6);
  auVar89 = vpmovsxbd_avx2(auVar78);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar65 * 0x12 + 6);
  auVar90 = vpmovsxbd_avx2(auVar73);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar65 * 0x13 + 6);
  auVar93 = vpmovsxbd_avx2(auVar3);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar65 * 0x14 + 6);
  auVar83 = vpmovsxbd_avx2(auVar80);
  auVar91 = vcvtdq2ps_avx(auVar93);
  auVar92 = vcvtdq2ps_avx(auVar83);
  auVar198._4_4_ = fVar127;
  auVar198._0_4_ = fVar127;
  auVar198._8_4_ = fVar127;
  auVar198._12_4_ = fVar127;
  auVar198._16_4_ = fVar127;
  auVar198._20_4_ = fVar127;
  auVar198._24_4_ = fVar127;
  auVar198._28_4_ = fVar127;
  auVar105._8_4_ = 1;
  auVar105._0_8_ = 0x100000001;
  auVar105._12_4_ = 1;
  auVar105._16_4_ = 1;
  auVar105._20_4_ = 1;
  auVar105._24_4_ = 1;
  auVar105._28_4_ = 1;
  auVar95 = ZEXT1632(CONCAT412(fVar141 * (ray->dir).field_0.m128[3],
                               CONCAT48(fVar141 * (ray->dir).field_0.m128[2],
                                        CONCAT44(fVar141 * (ray->dir).field_0.m128[1],fVar127))));
  auVar94 = vpermps_avx2(auVar105,auVar95);
  auVar81 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar82 = vpermps_avx512vl(auVar81,auVar95);
  fVar127 = auVar82._0_4_;
  fVar151 = auVar82._4_4_;
  auVar95._4_4_ = fVar151 * auVar86._4_4_;
  auVar95._0_4_ = fVar127 * auVar86._0_4_;
  fVar152 = auVar82._8_4_;
  auVar95._8_4_ = fVar152 * auVar86._8_4_;
  fVar154 = auVar82._12_4_;
  auVar95._12_4_ = fVar154 * auVar86._12_4_;
  fVar153 = auVar82._16_4_;
  auVar95._16_4_ = fVar153 * auVar86._16_4_;
  fVar155 = auVar82._20_4_;
  auVar95._20_4_ = fVar155 * auVar86._20_4_;
  fVar156 = auVar82._24_4_;
  auVar95._24_4_ = fVar156 * auVar86._24_4_;
  auVar95._28_4_ = auVar83._28_4_;
  auVar83._4_4_ = auVar89._4_4_ * fVar151;
  auVar83._0_4_ = auVar89._0_4_ * fVar127;
  auVar83._8_4_ = auVar89._8_4_ * fVar152;
  auVar83._12_4_ = auVar89._12_4_ * fVar154;
  auVar83._16_4_ = auVar89._16_4_ * fVar153;
  auVar83._20_4_ = auVar89._20_4_ * fVar155;
  auVar83._24_4_ = auVar89._24_4_ * fVar156;
  auVar83._28_4_ = auVar93._28_4_;
  auVar93._4_4_ = auVar92._4_4_ * fVar151;
  auVar93._0_4_ = auVar92._0_4_ * fVar127;
  auVar93._8_4_ = auVar92._8_4_ * fVar152;
  auVar93._12_4_ = auVar92._12_4_ * fVar154;
  auVar93._16_4_ = auVar92._16_4_ * fVar153;
  auVar93._20_4_ = auVar92._20_4_ * fVar155;
  auVar93._24_4_ = auVar92._24_4_ * fVar156;
  auVar93._28_4_ = auVar82._28_4_;
  auVar74 = vfmadd231ps_fma(auVar95,auVar94,auVar84);
  auVar75 = vfmadd231ps_fma(auVar83,auVar94,auVar88);
  auVar77 = vfmadd231ps_fma(auVar93,auVar91,auVar94);
  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar198,auVar85);
  auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar198,auVar87);
  auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar90,auVar198);
  auVar104._4_4_ = fVar157;
  auVar104._0_4_ = fVar157;
  auVar104._8_4_ = fVar157;
  auVar104._12_4_ = fVar157;
  auVar104._16_4_ = fVar157;
  auVar104._20_4_ = fVar157;
  auVar104._24_4_ = fVar157;
  auVar104._28_4_ = fVar157;
  auVar83 = ZEXT1632(CONCAT412(fVar141 * auVar79._12_4_,
                               CONCAT48(fVar141 * auVar79._8_4_,
                                        CONCAT44(fVar141 * auVar79._4_4_,fVar157))));
  auVar93 = vpermps_avx2(auVar105,auVar83);
  auVar83 = vpermps_avx512vl(auVar81,auVar83);
  fVar141 = auVar83._0_4_;
  fVar127 = auVar83._4_4_;
  auVar94._4_4_ = fVar127 * auVar86._4_4_;
  auVar94._0_4_ = fVar141 * auVar86._0_4_;
  fVar151 = auVar83._8_4_;
  auVar94._8_4_ = fVar151 * auVar86._8_4_;
  fVar152 = auVar83._12_4_;
  auVar94._12_4_ = fVar152 * auVar86._12_4_;
  fVar154 = auVar83._16_4_;
  auVar94._16_4_ = fVar154 * auVar86._16_4_;
  fVar153 = auVar83._20_4_;
  auVar94._20_4_ = fVar153 * auVar86._20_4_;
  fVar155 = auVar83._24_4_;
  auVar94._24_4_ = fVar155 * auVar86._24_4_;
  auVar94._28_4_ = 1;
  auVar81._4_4_ = auVar89._4_4_ * fVar127;
  auVar81._0_4_ = auVar89._0_4_ * fVar141;
  auVar81._8_4_ = auVar89._8_4_ * fVar151;
  auVar81._12_4_ = auVar89._12_4_ * fVar152;
  auVar81._16_4_ = auVar89._16_4_ * fVar154;
  auVar81._20_4_ = auVar89._20_4_ * fVar153;
  auVar81._24_4_ = auVar89._24_4_ * fVar155;
  auVar81._28_4_ = auVar86._28_4_;
  auVar89._4_4_ = auVar92._4_4_ * fVar127;
  auVar89._0_4_ = auVar92._0_4_ * fVar141;
  auVar89._8_4_ = auVar92._8_4_ * fVar151;
  auVar89._12_4_ = auVar92._12_4_ * fVar152;
  auVar89._16_4_ = auVar92._16_4_ * fVar154;
  auVar89._20_4_ = auVar92._20_4_ * fVar153;
  auVar89._24_4_ = auVar92._24_4_ * fVar155;
  auVar89._28_4_ = auVar83._28_4_;
  auVar76 = vfmadd231ps_fma(auVar94,auVar93,auVar84);
  auVar72 = vfmadd231ps_fma(auVar81,auVar93,auVar88);
  auVar78 = vfmadd231ps_fma(auVar89,auVar93,auVar91);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar104,auVar85);
  auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar104,auVar87);
  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar104,auVar90);
  auVar101._8_4_ = 0x7fffffff;
  auVar101._0_8_ = 0x7fffffff7fffffff;
  auVar101._12_4_ = 0x7fffffff;
  auVar101._16_4_ = 0x7fffffff;
  auVar101._20_4_ = 0x7fffffff;
  auVar101._24_4_ = 0x7fffffff;
  auVar101._28_4_ = 0x7fffffff;
  auVar85 = vandps_avx(ZEXT1632(auVar74),auVar101);
  auVar102._8_4_ = 0x219392ef;
  auVar102._0_8_ = 0x219392ef219392ef;
  auVar102._12_4_ = 0x219392ef;
  auVar102._16_4_ = 0x219392ef;
  auVar102._20_4_ = 0x219392ef;
  auVar102._24_4_ = 0x219392ef;
  auVar102._28_4_ = 0x219392ef;
  uVar70 = vcmpps_avx512vl(auVar85,auVar102,1);
  bVar67 = (bool)((byte)uVar70 & 1);
  auVar82._0_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar74._0_4_;
  bVar67 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar74._4_4_;
  bVar67 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar74._8_4_;
  bVar67 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar74._12_4_;
  auVar82._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * 0x219392ef;
  auVar82._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * 0x219392ef;
  auVar82._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * 0x219392ef;
  auVar82._28_4_ = (uint)(byte)(uVar70 >> 7) * 0x219392ef;
  auVar85 = vandps_avx(ZEXT1632(auVar75),auVar101);
  uVar70 = vcmpps_avx512vl(auVar85,auVar102,1);
  bVar67 = (bool)((byte)uVar70 & 1);
  auVar96._0_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar75._0_4_;
  bVar67 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar75._4_4_;
  bVar67 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar75._8_4_;
  bVar67 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar75._12_4_;
  auVar96._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * 0x219392ef;
  auVar96._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * 0x219392ef;
  auVar96._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * 0x219392ef;
  auVar96._28_4_ = (uint)(byte)(uVar70 >> 7) * 0x219392ef;
  auVar85 = vandps_avx(ZEXT1632(auVar77),auVar101);
  uVar70 = vcmpps_avx512vl(auVar85,auVar102,1);
  bVar67 = (bool)((byte)uVar70 & 1);
  auVar85._0_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar77._0_4_;
  bVar67 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar85._4_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar77._4_4_;
  bVar67 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar85._8_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar77._8_4_;
  bVar67 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar85._12_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar77._12_4_;
  auVar85._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * 0x219392ef;
  auVar85._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * 0x219392ef;
  auVar85._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * 0x219392ef;
  auVar85._28_4_ = (uint)(byte)(uVar70 >> 7) * 0x219392ef;
  auVar84 = vrcp14ps_avx512vl(auVar82);
  auVar103._8_4_ = 0x3f800000;
  auVar103._0_8_ = 0x3f8000003f800000;
  auVar103._12_4_ = 0x3f800000;
  auVar103._16_4_ = 0x3f800000;
  auVar103._20_4_ = 0x3f800000;
  auVar103._24_4_ = 0x3f800000;
  auVar103._28_4_ = 0x3f800000;
  auVar225 = ZEXT3264(auVar103);
  auVar74 = vfnmadd213ps_fma(auVar82,auVar84,auVar103);
  auVar74 = vfmadd132ps_fma(ZEXT1632(auVar74),auVar84,auVar84);
  auVar84 = vrcp14ps_avx512vl(auVar96);
  auVar75 = vfnmadd213ps_fma(auVar96,auVar84,auVar103);
  auVar75 = vfmadd132ps_fma(ZEXT1632(auVar75),auVar84,auVar84);
  auVar84 = vrcp14ps_avx512vl(auVar85);
  auVar77 = vfnmadd213ps_fma(auVar85,auVar84,auVar103);
  auVar77 = vfmadd132ps_fma(ZEXT1632(auVar77),auVar84,auVar84);
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar65 * 7 + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar76));
  auVar90._4_4_ = auVar74._4_4_ * auVar85._4_4_;
  auVar90._0_4_ = auVar74._0_4_ * auVar85._0_4_;
  auVar90._8_4_ = auVar74._8_4_ * auVar85._8_4_;
  auVar90._12_4_ = auVar74._12_4_ * auVar85._12_4_;
  auVar90._16_4_ = auVar85._16_4_ * 0.0;
  auVar90._20_4_ = auVar85._20_4_ * 0.0;
  auVar90._24_4_ = auVar85._24_4_ * 0.0;
  auVar90._28_4_ = auVar85._28_4_;
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar65 * 9 + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar76));
  auVar100._0_4_ = auVar74._0_4_ * auVar85._0_4_;
  auVar100._4_4_ = auVar74._4_4_ * auVar85._4_4_;
  auVar100._8_4_ = auVar74._8_4_ * auVar85._8_4_;
  auVar100._12_4_ = auVar74._12_4_ * auVar85._12_4_;
  auVar100._16_4_ = auVar85._16_4_ * 0.0;
  auVar100._20_4_ = auVar85._20_4_ * 0.0;
  auVar100._24_4_ = auVar85._24_4_ * 0.0;
  auVar100._28_4_ = 0;
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar65 * 0xe + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar72));
  auVar91._4_4_ = auVar75._4_4_ * auVar85._4_4_;
  auVar91._0_4_ = auVar75._0_4_ * auVar85._0_4_;
  auVar91._8_4_ = auVar75._8_4_ * auVar85._8_4_;
  auVar91._12_4_ = auVar75._12_4_ * auVar85._12_4_;
  auVar91._16_4_ = auVar85._16_4_ * 0.0;
  auVar91._20_4_ = auVar85._20_4_ * 0.0;
  auVar91._24_4_ = auVar85._24_4_ * 0.0;
  auVar91._28_4_ = auVar85._28_4_;
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar72));
  auVar99._0_4_ = auVar75._0_4_ * auVar85._0_4_;
  auVar99._4_4_ = auVar75._4_4_ * auVar85._4_4_;
  auVar99._8_4_ = auVar75._8_4_ * auVar85._8_4_;
  auVar99._12_4_ = auVar75._12_4_ * auVar85._12_4_;
  auVar99._16_4_ = auVar85._16_4_ * 0.0;
  auVar99._20_4_ = auVar85._20_4_ * 0.0;
  auVar99._24_4_ = auVar85._24_4_ * 0.0;
  auVar99._28_4_ = 0;
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar65 * 0x15 + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar78));
  auVar92._4_4_ = auVar85._4_4_ * auVar77._4_4_;
  auVar92._0_4_ = auVar85._0_4_ * auVar77._0_4_;
  auVar92._8_4_ = auVar85._8_4_ * auVar77._8_4_;
  auVar92._12_4_ = auVar85._12_4_ * auVar77._12_4_;
  auVar92._16_4_ = auVar85._16_4_ * 0.0;
  auVar92._20_4_ = auVar85._20_4_ * 0.0;
  auVar92._24_4_ = auVar85._24_4_ * 0.0;
  auVar92._28_4_ = auVar85._28_4_;
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar65 * 0x17 + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar78));
  auVar97._0_4_ = auVar77._0_4_ * auVar85._0_4_;
  auVar97._4_4_ = auVar77._4_4_ * auVar85._4_4_;
  auVar97._8_4_ = auVar77._8_4_ * auVar85._8_4_;
  auVar97._12_4_ = auVar77._12_4_ * auVar85._12_4_;
  auVar97._16_4_ = auVar85._16_4_ * 0.0;
  auVar97._20_4_ = auVar85._20_4_ * 0.0;
  auVar97._24_4_ = auVar85._24_4_ * 0.0;
  auVar97._28_4_ = 0;
  auVar85 = vpminsd_avx2(auVar90,auVar100);
  auVar84 = vpminsd_avx2(auVar91,auVar99);
  auVar85 = vmaxps_avx(auVar85,auVar84);
  auVar84 = vpminsd_avx2(auVar92,auVar97);
  uVar128 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar86._4_4_ = uVar128;
  auVar86._0_4_ = uVar128;
  auVar86._8_4_ = uVar128;
  auVar86._12_4_ = uVar128;
  auVar86._16_4_ = uVar128;
  auVar86._20_4_ = uVar128;
  auVar86._24_4_ = uVar128;
  auVar86._28_4_ = uVar128;
  auVar84 = vmaxps_avx512vl(auVar84,auVar86);
  auVar85 = vmaxps_avx(auVar85,auVar84);
  auVar84._8_4_ = 0x3f7ffffa;
  auVar84._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar84._12_4_ = 0x3f7ffffa;
  auVar84._16_4_ = 0x3f7ffffa;
  auVar84._20_4_ = 0x3f7ffffa;
  auVar84._24_4_ = 0x3f7ffffa;
  auVar84._28_4_ = 0x3f7ffffa;
  local_220 = vmulps_avx512vl(auVar85,auVar84);
  auVar85 = vpmaxsd_avx2(auVar90,auVar100);
  auVar84 = vpmaxsd_avx2(auVar91,auVar99);
  auVar85 = vminps_avx(auVar85,auVar84);
  auVar84 = vpmaxsd_avx2(auVar92,auVar97);
  fVar141 = ray->tfar;
  auVar87._4_4_ = fVar141;
  auVar87._0_4_ = fVar141;
  auVar87._8_4_ = fVar141;
  auVar87._12_4_ = fVar141;
  auVar87._16_4_ = fVar141;
  auVar87._20_4_ = fVar141;
  auVar87._24_4_ = fVar141;
  auVar87._28_4_ = fVar141;
  auVar84 = vminps_avx512vl(auVar84,auVar87);
  auVar85 = vminps_avx(auVar85,auVar84);
  auVar88._8_4_ = 0x3f800003;
  auVar88._0_8_ = 0x3f8000033f800003;
  auVar88._12_4_ = 0x3f800003;
  auVar88._16_4_ = 0x3f800003;
  auVar88._20_4_ = 0x3f800003;
  auVar88._24_4_ = 0x3f800003;
  auVar88._28_4_ = 0x3f800003;
  auVar85 = vmulps_avx512vl(auVar85,auVar88);
  auVar84 = vpbroadcastd_avx512vl();
  uVar14 = vcmpps_avx512vl(local_220,auVar85,2);
  uVar16 = vpcmpgtd_avx512vl(auVar84,_DAT_01fb4ba0);
  local_648 = CONCAT44((int)((ulong)in_R11 >> 0x20),(uint)(byte)((byte)uVar14 & (byte)uVar16));
  local_650 = prim;
LAB_01a70649:
  if (local_648 == 0) {
LAB_01a72d3b:
    return local_648 != 0;
  }
  lVar18 = 0;
  for (uVar70 = local_648; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
    lVar18 = lVar18 + 1;
  }
  local_908 = (ulong)*(uint *)(prim + 2);
  local_910 = (ulong)*(uint *)(prim + lVar18 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[local_908].ptr;
  uVar70 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_910);
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar18 = *(long *)&pGVar4[1].time_range.upper;
  auVar74 = *(undefined1 (*) [16])(lVar18 + (long)p_Var5 * uVar70);
  auVar75 = *(undefined1 (*) [16])(lVar18 + (uVar70 + 1) * (long)p_Var5);
  auVar77 = *(undefined1 (*) [16])(lVar18 + (uVar70 + 2) * (long)p_Var5);
  local_4c8 = local_648 - 1 & local_648;
  auVar76 = *(undefined1 (*) [16])(lVar18 + (uVar70 + 3) * (long)p_Var5);
  if (local_4c8 != 0) {
    uVar65 = local_4c8 - 1 & local_4c8;
    for (uVar70 = local_4c8; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
    }
    if (uVar65 != 0) {
      for (; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar201._0_4_ = auVar74._0_4_ + auVar75._0_4_ + auVar77._0_4_ + auVar76._0_4_;
  auVar201._4_4_ = auVar74._4_4_ + auVar75._4_4_ + auVar77._4_4_ + auVar76._4_4_;
  auVar201._8_4_ = auVar74._8_4_ + auVar75._8_4_ + auVar77._8_4_ + auVar76._8_4_;
  auVar201._12_4_ = auVar74._12_4_ + auVar75._12_4_ + auVar77._12_4_ + auVar76._12_4_;
  aVar1 = (ray->org).field_0;
  aVar2 = (ray->dir).field_0.field_1;
  auVar79._8_4_ = 0x3e800000;
  auVar79._0_8_ = 0x3e8000003e800000;
  auVar79._12_4_ = 0x3e800000;
  auVar72 = vmulps_avx512vl(auVar201,auVar79);
  auVar72 = vsubps_avx(auVar72,(undefined1  [16])aVar1);
  auVar72 = vdpps_avx(auVar72,(undefined1  [16])aVar2,0x7f);
  auVar78 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar219._4_12_ = ZEXT812(0) << 0x20;
  auVar219._0_4_ = auVar78._0_4_;
  auVar73 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar219);
  auVar78 = vfnmadd213ss_fma(auVar73,auVar78,ZEXT416(0x40000000));
  fVar141 = auVar72._0_4_ * auVar73._0_4_ * auVar78._0_4_;
  local_520 = ZEXT416((uint)fVar141);
  auVar202._4_4_ = fVar141;
  auVar202._0_4_ = fVar141;
  auVar202._8_4_ = fVar141;
  auVar202._12_4_ = fVar141;
  fStack_370 = fVar141;
  _local_380 = auVar202;
  fStack_36c = fVar141;
  fStack_368 = fVar141;
  fStack_364 = fVar141;
  auVar72 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar202);
  auVar72 = vblendps_avx(auVar72,ZEXT816(0) << 0x40,8);
  auVar74 = vsubps_avx(auVar74,auVar72);
  local_720 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[0]));
  auVar236 = ZEXT3264(local_720);
  auVar77 = vsubps_avx(auVar77,auVar72);
  auVar85 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[1]));
  auVar239 = ZEXT3264(auVar85);
  local_760 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[2]));
  auVar238 = ZEXT3264(local_760);
  auVar75 = vsubps_avx(auVar75,auVar72);
  auVar76 = vsubps_avx(auVar76,auVar72);
  uVar128 = auVar74._0_4_;
  local_5e0._4_4_ = uVar128;
  local_5e0._0_4_ = uVar128;
  local_5e0._8_4_ = uVar128;
  local_5e0._12_4_ = uVar128;
  local_5e0._16_4_ = uVar128;
  local_5e0._20_4_ = uVar128;
  local_5e0._24_4_ = uVar128;
  local_5e0._28_4_ = uVar128;
  auVar221 = ZEXT3264(local_5e0);
  auVar109._8_4_ = 1;
  auVar109._0_8_ = 0x100000001;
  auVar109._12_4_ = 1;
  auVar109._16_4_ = 1;
  auVar109._20_4_ = 1;
  auVar109._24_4_ = 1;
  auVar109._28_4_ = 1;
  local_440 = ZEXT1632(auVar74);
  local_600 = vpermps_avx2(auVar109,local_440);
  auVar223 = ZEXT3264(local_600);
  auVar110._8_4_ = 2;
  auVar110._0_8_ = 0x200000002;
  auVar110._12_4_ = 2;
  auVar110._16_4_ = 2;
  auVar110._20_4_ = 2;
  auVar110._24_4_ = 2;
  auVar110._28_4_ = 2;
  local_620 = vpermps_avx2(auVar110,local_440);
  auVar172._8_4_ = 3;
  auVar172._0_8_ = 0x300000003;
  auVar172._12_4_ = 3;
  auVar172._16_4_ = 3;
  auVar172._20_4_ = 3;
  auVar172._24_4_ = 3;
  auVar172._28_4_ = 3;
  local_780 = vpermps_avx512vl(auVar172,local_440);
  auVar242 = ZEXT3264(local_780);
  uVar128 = auVar75._0_4_;
  local_4c0._4_4_ = uVar128;
  local_4c0._0_4_ = uVar128;
  local_4c0._8_4_ = uVar128;
  local_4c0._12_4_ = uVar128;
  local_4c0._16_4_ = uVar128;
  local_4c0._20_4_ = uVar128;
  local_4c0._24_4_ = uVar128;
  local_4c0._28_4_ = uVar128;
  local_480 = ZEXT1632(auVar75);
  local_640 = vpermps_avx2(auVar109,local_480);
  local_7a0 = vpermps_avx2(auVar110,local_480);
  auVar229 = ZEXT3264(local_7a0);
  local_7c0 = vpermps_avx512vl(auVar172,local_480);
  auVar230 = ZEXT3264(local_7c0);
  auVar218 = ZEXT3264(local_620);
  local_7e0 = vbroadcastss_avx512vl(auVar77);
  auVar231 = ZEXT3264(local_7e0);
  local_460 = ZEXT1632(auVar77);
  local_800 = vpermps_avx512vl(auVar109,local_460);
  auVar232 = ZEXT3264(local_800);
  local_820 = vpermps_avx512vl(auVar110,local_460);
  auVar233 = ZEXT3264(local_820);
  local_840 = vpermps_avx512vl(auVar172,local_460);
  auVar234 = ZEXT3264(local_840);
  local_860 = vbroadcastss_avx512vl(auVar76);
  auVar235 = ZEXT3264(local_860);
  _local_4a0 = ZEXT1632(auVar76);
  local_880 = vpermps_avx512vl(auVar109,_local_4a0);
  auVar237 = ZEXT3264(local_880);
  local_8a0 = vpermps_avx512vl(auVar110,_local_4a0);
  auVar240 = ZEXT3264(local_8a0);
  local_8c0 = vpermps_avx512vl(auVar172,_local_4a0);
  auVar241 = ZEXT3264(local_8c0);
  auVar200 = ZEXT3264(local_4c0);
  auVar213 = ZEXT3264(local_640);
  auVar84 = vpermps_avx512vl(auVar110,ZEXT1632(CONCAT412(aVar2.field_3.w * aVar2.field_3.w,
                                                         CONCAT48(aVar2.z * aVar2.z,
                                                                  CONCAT44(aVar2.y * aVar2.y,
                                                                           aVar2.x * aVar2.x)))));
  auVar85 = vfmadd231ps_avx512vl(auVar84,auVar85,auVar85);
  local_1e0 = vfmadd231ps_avx512vl(auVar85,local_720,local_720);
  auVar108._8_4_ = 0x7fffffff;
  auVar108._0_8_ = 0x7fffffff7fffffff;
  auVar108._12_4_ = 0x7fffffff;
  auVar108._16_4_ = 0x7fffffff;
  auVar108._20_4_ = 0x7fffffff;
  auVar108._24_4_ = 0x7fffffff;
  auVar108._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_1e0,auVar108);
  uVar62 = 0;
  bVar66 = 0;
  local_928 = 1;
  local_2f0 = ZEXT816(0x3f80000000000000);
  local_200 = local_1e0;
  do {
    auVar74 = vmovshdup_avx(local_2f0);
    auVar74 = vsubps_avx(auVar74,local_2f0);
    fVar141 = auVar74._0_4_;
    fVar154 = fVar141 * 0.04761905;
    local_8e0._0_4_ = local_2f0._0_4_;
    local_8e0._4_4_ = local_8e0._0_4_;
    fStack_8d8 = (float)local_8e0._0_4_;
    fStack_8d4 = (float)local_8e0._0_4_;
    register0x000012d0 = local_8e0._0_4_;
    register0x000012d4 = local_8e0._0_4_;
    register0x000012d8 = local_8e0._0_4_;
    register0x000012dc = local_8e0._0_4_;
    auVar203._4_4_ = fVar141;
    auVar203._0_4_ = fVar141;
    auVar203._8_4_ = fVar141;
    auVar203._12_4_ = fVar141;
    local_900._16_4_ = fVar141;
    local_900._0_16_ = auVar203;
    local_900._20_4_ = fVar141;
    local_900._24_4_ = fVar141;
    local_900._28_4_ = fVar141;
    auVar74 = vfmadd231ps_fma(_local_8e0,local_900,_DAT_01f7b040);
    auVar85 = vsubps_avx(auVar225._0_32_,ZEXT1632(auVar74));
    fVar141 = auVar74._0_4_;
    fVar127 = auVar74._4_4_;
    auVar59._4_4_ = auVar200._4_4_ * fVar127;
    auVar59._0_4_ = auVar200._0_4_ * fVar141;
    fVar151 = auVar74._8_4_;
    auVar59._8_4_ = auVar200._8_4_ * fVar151;
    fVar152 = auVar74._12_4_;
    auVar59._12_4_ = auVar200._12_4_ * fVar152;
    auVar59._16_4_ = auVar200._16_4_ * 0.0;
    auVar59._20_4_ = auVar200._20_4_ * 0.0;
    auVar59._24_4_ = auVar200._24_4_ * 0.0;
    auVar59._28_4_ = DAT_01f7b040._28_4_;
    auVar42._4_4_ = auVar213._4_4_ * fVar127;
    auVar42._0_4_ = auVar213._0_4_ * fVar141;
    auVar42._8_4_ = auVar213._8_4_ * fVar151;
    auVar42._12_4_ = auVar213._12_4_ * fVar152;
    auVar42._16_4_ = auVar213._16_4_ * 0.0;
    auVar42._20_4_ = auVar213._20_4_ * 0.0;
    auVar42._24_4_ = auVar213._24_4_ * 0.0;
    auVar42._28_4_ = local_8e0._0_4_;
    auVar225._0_4_ = auVar229._0_4_ * fVar141;
    auVar225._4_4_ = auVar229._4_4_ * fVar127;
    auVar225._8_4_ = auVar229._8_4_ * fVar151;
    auVar225._12_4_ = auVar229._12_4_ * fVar152;
    auVar225._16_4_ = auVar229._16_4_ * 0.0;
    auVar225._20_4_ = auVar229._20_4_ * 0.0;
    auVar225._28_36_ = auVar200._28_36_;
    auVar225._24_4_ = auVar229._24_4_ * 0.0;
    auVar84 = vmulps_avx512vl(auVar230._0_32_,ZEXT1632(auVar74));
    auVar75 = vfmadd231ps_fma(auVar59,auVar85,auVar221._0_32_);
    auVar77 = vfmadd231ps_fma(auVar42,auVar85,auVar223._0_32_);
    auVar76 = vfmadd231ps_fma(auVar225._0_32_,auVar85,auVar218._0_32_);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar85,auVar242._0_32_);
    auVar86 = vmulps_avx512vl(auVar231._0_32_,ZEXT1632(auVar74));
    auVar91 = ZEXT1632(auVar74);
    auVar87 = vmulps_avx512vl(auVar232._0_32_,auVar91);
    auVar88 = vmulps_avx512vl(auVar233._0_32_,auVar91);
    auVar89 = vmulps_avx512vl(auVar234._0_32_,auVar91);
    auVar72 = vfmadd231ps_fma(auVar86,auVar85,auVar200._0_32_);
    auVar78 = vfmadd231ps_fma(auVar87,auVar85,auVar213._0_32_);
    auVar73 = vfmadd231ps_fma(auVar88,auVar85,auVar229._0_32_);
    auVar86 = vfmadd231ps_avx512vl(auVar89,auVar85,auVar230._0_32_);
    auVar87 = vmulps_avx512vl(auVar235._0_32_,auVar91);
    auVar88 = vmulps_avx512vl(auVar237._0_32_,auVar91);
    auVar89 = vmulps_avx512vl(auVar240._0_32_,auVar91);
    auVar90 = vmulps_avx512vl(auVar241._0_32_,auVar91);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar85,auVar231._0_32_);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar85,auVar232._0_32_);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar85,auVar233._0_32_);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar85,auVar234._0_32_);
    auVar200._28_36_ = auVar229._28_36_;
    auVar200._0_28_ =
         ZEXT1628(CONCAT412(fVar152 * auVar72._12_4_,
                            CONCAT48(fVar151 * auVar72._8_4_,
                                     CONCAT44(fVar127 * auVar72._4_4_,fVar141 * auVar72._0_4_))));
    auVar91 = vmulps_avx512vl(auVar91,ZEXT1632(auVar78));
    auVar83 = ZEXT1632(auVar74);
    auVar92 = vmulps_avx512vl(auVar83,ZEXT1632(auVar73));
    auVar93 = vmulps_avx512vl(auVar83,auVar86);
    auVar74 = vfmadd231ps_fma(auVar200._0_32_,auVar85,ZEXT1632(auVar75));
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar85,ZEXT1632(auVar77));
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar85,ZEXT1632(auVar76));
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar85,auVar84);
    auVar43._4_4_ = auVar87._4_4_ * fVar127;
    auVar43._0_4_ = auVar87._0_4_ * fVar141;
    auVar43._8_4_ = auVar87._8_4_ * fVar151;
    auVar43._12_4_ = auVar87._12_4_ * fVar152;
    auVar43._16_4_ = auVar87._16_4_ * 0.0;
    auVar43._20_4_ = auVar87._20_4_ * 0.0;
    auVar43._24_4_ = auVar87._24_4_ * 0.0;
    auVar43._28_4_ = auVar84._28_4_;
    auVar44._4_4_ = auVar88._4_4_ * fVar127;
    auVar44._0_4_ = auVar88._0_4_ * fVar141;
    auVar44._8_4_ = auVar88._8_4_ * fVar151;
    auVar44._12_4_ = auVar88._12_4_ * fVar152;
    auVar44._16_4_ = auVar88._16_4_ * 0.0;
    auVar44._20_4_ = auVar88._20_4_ * 0.0;
    auVar44._24_4_ = auVar88._24_4_ * 0.0;
    auVar44._28_4_ = auVar87._28_4_;
    auVar45._4_4_ = auVar89._4_4_ * fVar127;
    auVar45._0_4_ = auVar89._0_4_ * fVar141;
    auVar45._8_4_ = auVar89._8_4_ * fVar151;
    auVar45._12_4_ = auVar89._12_4_ * fVar152;
    auVar45._16_4_ = auVar89._16_4_ * 0.0;
    auVar45._20_4_ = auVar89._20_4_ * 0.0;
    auVar45._24_4_ = auVar89._24_4_ * 0.0;
    auVar45._28_4_ = auVar88._28_4_;
    auVar46._4_4_ = auVar90._4_4_ * fVar127;
    auVar46._0_4_ = auVar90._0_4_ * fVar141;
    auVar46._8_4_ = auVar90._8_4_ * fVar151;
    auVar46._12_4_ = auVar90._12_4_ * fVar152;
    auVar46._16_4_ = auVar90._16_4_ * 0.0;
    auVar46._20_4_ = auVar90._20_4_ * 0.0;
    auVar46._24_4_ = auVar90._24_4_ * 0.0;
    auVar46._28_4_ = auVar89._28_4_;
    auVar75 = vfmadd231ps_fma(auVar43,auVar85,ZEXT1632(auVar72));
    auVar77 = vfmadd231ps_fma(auVar44,auVar85,ZEXT1632(auVar78));
    auVar76 = vfmadd231ps_fma(auVar45,auVar85,ZEXT1632(auVar73));
    auVar72 = vfmadd231ps_fma(auVar46,auVar85,auVar86);
    auVar84 = vmulps_avx512vl(auVar83,ZEXT1632(auVar76));
    auVar78 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar152 * auVar75._12_4_,
                                                 CONCAT48(fVar151 * auVar75._8_4_,
                                                          CONCAT44(fVar127 * auVar75._4_4_,
                                                                   fVar141 * auVar75._0_4_)))),
                              auVar85,ZEXT1632(auVar74));
    auVar89 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar77._12_4_ * fVar152,
                                            CONCAT48(auVar77._8_4_ * fVar151,
                                                     CONCAT44(auVar77._4_4_ * fVar127,
                                                              auVar77._0_4_ * fVar141)))),auVar85,
                         auVar91);
    local_580 = vfmadd231ps_avx512vl(auVar84,auVar85,auVar92);
    auVar86 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar72._12_4_ * fVar152,
                                            CONCAT48(auVar72._8_4_ * fVar151,
                                                     CONCAT44(auVar72._4_4_ * fVar127,
                                                              auVar72._0_4_ * fVar141)))),auVar93,
                         auVar85);
    auVar85 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar74));
    auVar84 = vsubps_avx512vl(ZEXT1632(auVar77),auVar91);
    auVar87 = vsubps_avx512vl(ZEXT1632(auVar76),auVar92);
    auVar88 = vsubps_avx512vl(ZEXT1632(auVar72),auVar93);
    auVar173._0_4_ = fVar154 * auVar85._0_4_ * 3.0;
    auVar173._4_4_ = fVar154 * auVar85._4_4_ * 3.0;
    auVar173._8_4_ = fVar154 * auVar85._8_4_ * 3.0;
    auVar173._12_4_ = fVar154 * auVar85._12_4_ * 3.0;
    auVar173._16_4_ = fVar154 * auVar85._16_4_ * 3.0;
    auVar173._20_4_ = fVar154 * auVar85._20_4_ * 3.0;
    auVar173._24_4_ = fVar154 * auVar85._24_4_ * 3.0;
    auVar173._28_4_ = 0;
    auVar227._0_4_ = fVar154 * auVar84._0_4_ * 3.0;
    auVar227._4_4_ = fVar154 * auVar84._4_4_ * 3.0;
    auVar227._8_4_ = fVar154 * auVar84._8_4_ * 3.0;
    auVar227._12_4_ = fVar154 * auVar84._12_4_ * 3.0;
    auVar227._16_4_ = fVar154 * auVar84._16_4_ * 3.0;
    auVar227._20_4_ = fVar154 * auVar84._20_4_ * 3.0;
    auVar227._24_4_ = fVar154 * auVar84._24_4_ * 3.0;
    auVar227._28_4_ = 0;
    auVar228._0_4_ = fVar154 * auVar87._0_4_ * 3.0;
    auVar228._4_4_ = fVar154 * auVar87._4_4_ * 3.0;
    auVar228._8_4_ = fVar154 * auVar87._8_4_ * 3.0;
    auVar228._12_4_ = fVar154 * auVar87._12_4_ * 3.0;
    auVar228._16_4_ = fVar154 * auVar87._16_4_ * 3.0;
    auVar228._20_4_ = fVar154 * auVar87._20_4_ * 3.0;
    auVar228._24_4_ = fVar154 * auVar87._24_4_ * 3.0;
    auVar228._28_4_ = 0;
    fVar141 = auVar88._0_4_ * 3.0 * fVar154;
    fVar127 = auVar88._4_4_ * 3.0 * fVar154;
    auVar47._4_4_ = fVar127;
    auVar47._0_4_ = fVar141;
    fVar151 = auVar88._8_4_ * 3.0 * fVar154;
    auVar47._8_4_ = fVar151;
    fVar152 = auVar88._12_4_ * 3.0 * fVar154;
    auVar47._12_4_ = fVar152;
    fVar153 = auVar88._16_4_ * 3.0 * fVar154;
    auVar47._16_4_ = fVar153;
    fVar155 = auVar88._20_4_ * 3.0 * fVar154;
    auVar47._20_4_ = fVar155;
    fVar156 = auVar88._24_4_ * 3.0 * fVar154;
    auVar47._24_4_ = fVar156;
    auVar47._28_4_ = fVar154;
    auVar74 = vxorps_avx512vl(auVar242._0_16_,auVar242._0_16_);
    auVar90 = vpermt2ps_avx512vl(ZEXT1632(auVar78),_DAT_01fb9fc0,ZEXT1632(auVar74));
    auVar91 = vpermt2ps_avx512vl(auVar89,_DAT_01fb9fc0,ZEXT1632(auVar74));
    auVar87 = ZEXT1632(auVar74);
    auVar92 = vpermt2ps_avx512vl(local_580,_DAT_01fb9fc0,auVar87);
    auVar208._0_4_ = auVar86._0_4_ + fVar141;
    auVar208._4_4_ = auVar86._4_4_ + fVar127;
    auVar208._8_4_ = auVar86._8_4_ + fVar151;
    auVar208._12_4_ = auVar86._12_4_ + fVar152;
    auVar208._16_4_ = auVar86._16_4_ + fVar153;
    auVar208._20_4_ = auVar86._20_4_ + fVar155;
    auVar208._24_4_ = auVar86._24_4_ + fVar156;
    auVar208._28_4_ = auVar86._28_4_ + fVar154;
    auVar85 = vmaxps_avx(auVar86,auVar208);
    auVar84 = vminps_avx(auVar86,auVar208);
    auVar93 = vpermt2ps_avx512vl(auVar86,_DAT_01fb9fc0,auVar87);
    auVar83 = vpermt2ps_avx512vl(auVar173,_DAT_01fb9fc0,auVar87);
    auVar94 = vpermt2ps_avx512vl(auVar227,_DAT_01fb9fc0,auVar87);
    auVar104 = ZEXT1632(auVar74);
    auVar95 = vpermt2ps_avx512vl(auVar228,_DAT_01fb9fc0,auVar104);
    auVar86 = vpermt2ps_avx512vl(auVar47,_DAT_01fb9fc0,auVar104);
    auVar86 = vsubps_avx(auVar93,auVar86);
    auVar87 = vsubps_avx(auVar90,ZEXT1632(auVar78));
    auVar88 = vsubps_avx(auVar91,auVar89);
    auVar81 = vsubps_avx512vl(auVar92,local_580);
    auVar82 = vmulps_avx512vl(auVar88,auVar228);
    auVar82 = vfmsub231ps_avx512vl(auVar82,auVar227,auVar81);
    auVar96 = vmulps_avx512vl(auVar81,auVar173);
    auVar96 = vfmsub231ps_avx512vl(auVar96,auVar228,auVar87);
    auVar97 = vmulps_avx512vl(auVar87,auVar227);
    auVar97 = vfmsub231ps_avx512vl(auVar97,auVar173,auVar88);
    auVar97 = vmulps_avx512vl(auVar97,auVar97);
    auVar96 = vfmadd231ps_avx512vl(auVar97,auVar96,auVar96);
    auVar82 = vfmadd231ps_avx512vl(auVar96,auVar82,auVar82);
    auVar96 = vmulps_avx512vl(auVar81,auVar81);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar88,auVar88);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar87,auVar87);
    auVar97 = vrcp14ps_avx512vl(auVar96);
    auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar99 = vfnmadd213ps_avx512vl(auVar97,auVar96,auVar98);
    auVar97 = vfmadd132ps_avx512vl(auVar99,auVar97,auVar97);
    auVar82 = vmulps_avx512vl(auVar82,auVar97);
    auVar99 = vmulps_avx512vl(auVar88,auVar95);
    auVar99 = vfmsub231ps_avx512vl(auVar99,auVar94,auVar81);
    auVar100 = vmulps_avx512vl(auVar81,auVar83);
    auVar100 = vfmsub231ps_avx512vl(auVar100,auVar95,auVar87);
    auVar101 = vmulps_avx512vl(auVar87,auVar94);
    auVar101 = vfmsub231ps_avx512vl(auVar101,auVar83,auVar88);
    auVar101 = vmulps_avx512vl(auVar101,auVar101);
    auVar100 = vfmadd231ps_avx512vl(auVar101,auVar100,auVar100);
    auVar99 = vfmadd231ps_avx512vl(auVar100,auVar99,auVar99);
    auVar97 = vmulps_avx512vl(auVar99,auVar97);
    auVar82 = vmaxps_avx512vl(auVar82,auVar97);
    auVar82 = vsqrtps_avx512vl(auVar82);
    auVar97 = vmaxps_avx512vl(auVar86,auVar93);
    auVar85 = vmaxps_avx512vl(auVar85,auVar97);
    auVar97 = vaddps_avx512vl(auVar82,auVar85);
    auVar85 = vminps_avx(auVar86,auVar93);
    auVar85 = vminps_avx(auVar84,auVar85);
    auVar85 = vsubps_avx512vl(auVar85,auVar82);
    auVar29._8_4_ = 0x3f800002;
    auVar29._0_8_ = 0x3f8000023f800002;
    auVar29._12_4_ = 0x3f800002;
    auVar29._16_4_ = 0x3f800002;
    auVar29._20_4_ = 0x3f800002;
    auVar29._24_4_ = 0x3f800002;
    auVar29._28_4_ = 0x3f800002;
    auVar84 = vmulps_avx512vl(auVar97,auVar29);
    auVar30._8_4_ = 0x3f7ffffc;
    auVar30._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar30._12_4_ = 0x3f7ffffc;
    auVar30._16_4_ = 0x3f7ffffc;
    auVar30._20_4_ = 0x3f7ffffc;
    auVar30._24_4_ = 0x3f7ffffc;
    auVar30._28_4_ = 0x3f7ffffc;
    local_5c0 = vmulps_avx512vl(auVar85,auVar30);
    auVar85 = vmulps_avx512vl(auVar84,auVar84);
    auVar84 = vrsqrt14ps_avx512vl(auVar96);
    auVar31._8_4_ = 0xbf000000;
    auVar31._0_8_ = 0xbf000000bf000000;
    auVar31._12_4_ = 0xbf000000;
    auVar31._16_4_ = 0xbf000000;
    auVar31._20_4_ = 0xbf000000;
    auVar31._24_4_ = 0xbf000000;
    auVar31._28_4_ = 0xbf000000;
    auVar86 = vmulps_avx512vl(auVar96,auVar31);
    fVar141 = auVar84._0_4_;
    fVar127 = auVar84._4_4_;
    fVar151 = auVar84._8_4_;
    fVar152 = auVar84._12_4_;
    fVar154 = auVar84._16_4_;
    fVar153 = auVar84._20_4_;
    fVar155 = auVar84._24_4_;
    auVar48._4_4_ = fVar127 * fVar127 * fVar127 * auVar86._4_4_;
    auVar48._0_4_ = fVar141 * fVar141 * fVar141 * auVar86._0_4_;
    auVar48._8_4_ = fVar151 * fVar151 * fVar151 * auVar86._8_4_;
    auVar48._12_4_ = fVar152 * fVar152 * fVar152 * auVar86._12_4_;
    auVar48._16_4_ = fVar154 * fVar154 * fVar154 * auVar86._16_4_;
    auVar48._20_4_ = fVar153 * fVar153 * fVar153 * auVar86._20_4_;
    auVar48._24_4_ = fVar155 * fVar155 * fVar155 * auVar86._24_4_;
    auVar48._28_4_ = auVar97._28_4_;
    auVar32._8_4_ = 0x3fc00000;
    auVar32._0_8_ = 0x3fc000003fc00000;
    auVar32._12_4_ = 0x3fc00000;
    auVar32._16_4_ = 0x3fc00000;
    auVar32._20_4_ = 0x3fc00000;
    auVar32._24_4_ = 0x3fc00000;
    auVar32._28_4_ = 0x3fc00000;
    auVar84 = vfmadd231ps_avx512vl(auVar48,auVar84,auVar32);
    auVar86 = vmulps_avx512vl(auVar87,auVar84);
    auVar93 = vmulps_avx512vl(auVar88,auVar84);
    auVar82 = vmulps_avx512vl(auVar81,auVar84);
    auVar198 = ZEXT1632(auVar78);
    auVar96 = vsubps_avx512vl(auVar104,auVar198);
    auVar97 = vsubps_avx512vl(auVar104,auVar89);
    auVar99 = vsubps_avx512vl(auVar104,local_580);
    auVar100 = vmulps_avx512vl(auVar238._0_32_,auVar99);
    local_6c0 = auVar239._0_32_;
    auVar100 = vfmadd231ps_avx512vl(auVar100,local_6c0,auVar97);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar236._0_32_,auVar96);
    auVar101 = vmulps_avx512vl(auVar99,auVar99);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,auVar97);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar96,auVar96);
    auVar102 = vmulps_avx512vl(auVar238._0_32_,auVar82);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar93,local_6c0);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar86,auVar236._0_32_);
    auVar82 = vmulps_avx512vl(auVar99,auVar82);
    auVar93 = vfmadd231ps_avx512vl(auVar82,auVar97,auVar93);
    auVar86 = vfmadd231ps_avx512vl(auVar93,auVar96,auVar86);
    auVar93 = vmulps_avx512vl(auVar102,auVar102);
    auVar82 = vsubps_avx512vl(local_200,auVar93);
    auVar103 = vmulps_avx512vl(auVar102,auVar86);
    auVar100 = vsubps_avx512vl(auVar100,auVar103);
    auVar100 = vaddps_avx512vl(auVar100,auVar100);
    auVar103 = vmulps_avx512vl(auVar86,auVar86);
    local_540 = vsubps_avx512vl(auVar101,auVar103);
    auVar85 = vsubps_avx512vl(local_540,auVar85);
    local_3a0 = vmulps_avx512vl(auVar100,auVar100);
    auVar33._8_4_ = 0x40800000;
    auVar33._0_8_ = 0x4080000040800000;
    auVar33._12_4_ = 0x40800000;
    auVar33._16_4_ = 0x40800000;
    auVar33._20_4_ = 0x40800000;
    auVar33._24_4_ = 0x40800000;
    auVar33._28_4_ = 0x40800000;
    _local_3c0 = vmulps_avx512vl(auVar82,auVar33);
    auVar101 = vmulps_avx512vl(_local_3c0,auVar85);
    auVar101 = vsubps_avx512vl(local_3a0,auVar101);
    uVar70 = vcmpps_avx512vl(auVar101,auVar104,5);
    bVar60 = (byte)uVar70;
    if (bVar60 == 0) {
LAB_01a71263:
      auVar236 = ZEXT3264(local_720);
      auVar225 = ZEXT3264(auVar98);
      auVar238 = ZEXT3264(local_760);
      auVar221 = ZEXT3264(local_5e0);
      auVar223 = ZEXT3264(local_600);
      auVar218 = ZEXT3264(local_620);
      auVar242 = ZEXT3264(local_780);
      auVar200 = ZEXT3264(local_4c0);
      auVar213 = ZEXT3264(local_640);
      auVar229 = ZEXT3264(local_7a0);
      auVar230 = ZEXT3264(local_7c0);
      auVar231 = ZEXT3264(local_7e0);
      auVar232 = ZEXT3264(local_800);
      auVar233 = ZEXT3264(local_820);
      auVar234 = ZEXT3264(local_840);
      auVar235 = ZEXT3264(local_860);
      auVar237 = ZEXT3264(local_880);
      auVar240 = ZEXT3264(local_8a0);
      auVar241 = ZEXT3264(local_8c0);
    }
    else {
      auVar101 = vsqrtps_avx512vl(auVar101);
      auVar103 = vaddps_avx512vl(auVar82,auVar82);
      local_560 = vrcp14ps_avx512vl(auVar103);
      auVar104 = vfnmadd213ps_avx512vl(local_560,auVar103,auVar98);
      auVar104 = vfmadd132ps_avx512vl(auVar104,local_560,local_560);
      auVar34._8_4_ = 0x80000000;
      auVar34._0_8_ = 0x8000000080000000;
      auVar34._12_4_ = 0x80000000;
      auVar34._16_4_ = 0x80000000;
      auVar34._20_4_ = 0x80000000;
      auVar34._24_4_ = 0x80000000;
      auVar34._28_4_ = 0x80000000;
      local_3e0 = vxorps_avx512vl(auVar100,auVar34);
      auVar105 = vsubps_avx512vl(local_3e0,auVar101);
      auVar105 = vmulps_avx512vl(auVar105,auVar104);
      auVar101 = vsubps_avx512vl(auVar101,auVar100);
      local_5a0 = vmulps_avx512vl(auVar101,auVar104);
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar101 = vblendmps_avx512vl(auVar101,auVar105);
      auVar106._0_4_ =
           (uint)(bVar60 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar104._0_4_;
      bVar67 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar106._4_4_ = (uint)bVar67 * auVar101._4_4_ | (uint)!bVar67 * auVar104._4_4_;
      bVar67 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar106._8_4_ = (uint)bVar67 * auVar101._8_4_ | (uint)!bVar67 * auVar104._8_4_;
      bVar67 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar106._12_4_ = (uint)bVar67 * auVar101._12_4_ | (uint)!bVar67 * auVar104._12_4_;
      bVar67 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar106._16_4_ = (uint)bVar67 * auVar101._16_4_ | (uint)!bVar67 * auVar104._16_4_;
      bVar67 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar106._20_4_ = (uint)bVar67 * auVar101._20_4_ | (uint)!bVar67 * auVar104._20_4_;
      bVar67 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar106._24_4_ = (uint)bVar67 * auVar101._24_4_ | (uint)!bVar67 * auVar104._24_4_;
      bVar67 = SUB81(uVar70 >> 7,0);
      auVar106._28_4_ = (uint)bVar67 * auVar101._28_4_ | (uint)!bVar67 * auVar104._28_4_;
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar104 = vblendmps_avx512vl(auVar101,local_5a0);
      auVar107._0_4_ =
           (uint)(bVar60 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar101._0_4_;
      bVar67 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar107._4_4_ = (uint)bVar67 * auVar104._4_4_ | (uint)!bVar67 * auVar101._4_4_;
      bVar67 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar107._8_4_ = (uint)bVar67 * auVar104._8_4_ | (uint)!bVar67 * auVar101._8_4_;
      bVar67 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar107._12_4_ = (uint)bVar67 * auVar104._12_4_ | (uint)!bVar67 * auVar101._12_4_;
      bVar67 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar107._16_4_ = (uint)bVar67 * auVar104._16_4_ | (uint)!bVar67 * auVar101._16_4_;
      bVar67 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar107._20_4_ = (uint)bVar67 * auVar104._20_4_ | (uint)!bVar67 * auVar101._20_4_;
      bVar67 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar107._24_4_ = (uint)bVar67 * auVar104._24_4_ | (uint)!bVar67 * auVar101._24_4_;
      bVar67 = SUB81(uVar70 >> 7,0);
      auVar107._28_4_ = (uint)bVar67 * auVar104._28_4_ | (uint)!bVar67 * auVar101._28_4_;
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar93,auVar101);
      local_400 = vmaxps_avx512vl(local_1e0,auVar101);
      auVar35._8_4_ = 0x36000000;
      auVar35._0_8_ = 0x3600000036000000;
      auVar35._12_4_ = 0x36000000;
      auVar35._16_4_ = 0x36000000;
      auVar35._20_4_ = 0x36000000;
      auVar35._24_4_ = 0x36000000;
      auVar35._28_4_ = 0x36000000;
      local_420 = vmulps_avx512vl(local_400,auVar35);
      vandps_avx512vl(auVar82,auVar101);
      uVar65 = vcmpps_avx512vl(local_420,local_420,1);
      uVar70 = uVar70 & uVar65;
      bVar63 = (byte)uVar70;
      if (bVar63 != 0) {
        uVar65 = vcmpps_avx512vl(auVar85,_DAT_01f7b000,2);
        auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar82 = vblendmps_avx512vl(auVar85,auVar93);
        bVar64 = (byte)uVar65;
        uVar71 = (uint)(bVar64 & 1) * auVar82._0_4_ | (uint)!(bool)(bVar64 & 1) * local_420._0_4_;
        bVar67 = (bool)((byte)(uVar65 >> 1) & 1);
        uVar120 = (uint)bVar67 * auVar82._4_4_ | (uint)!bVar67 * local_420._4_4_;
        bVar67 = (bool)((byte)(uVar65 >> 2) & 1);
        uVar121 = (uint)bVar67 * auVar82._8_4_ | (uint)!bVar67 * local_420._8_4_;
        bVar67 = (bool)((byte)(uVar65 >> 3) & 1);
        uVar122 = (uint)bVar67 * auVar82._12_4_ | (uint)!bVar67 * local_420._12_4_;
        bVar67 = (bool)((byte)(uVar65 >> 4) & 1);
        uVar123 = (uint)bVar67 * auVar82._16_4_ | (uint)!bVar67 * local_420._16_4_;
        bVar67 = (bool)((byte)(uVar65 >> 5) & 1);
        uVar124 = (uint)bVar67 * auVar82._20_4_ | (uint)!bVar67 * local_420._20_4_;
        bVar67 = (bool)((byte)(uVar65 >> 6) & 1);
        uVar125 = (uint)bVar67 * auVar82._24_4_ | (uint)!bVar67 * local_420._24_4_;
        bVar67 = SUB81(uVar65 >> 7,0);
        uVar126 = (uint)bVar67 * auVar82._28_4_ | (uint)!bVar67 * local_420._28_4_;
        auVar106._0_4_ = (bVar63 & 1) * uVar71 | !(bool)(bVar63 & 1) * auVar106._0_4_;
        bVar67 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar106._4_4_ = bVar67 * uVar120 | !bVar67 * auVar106._4_4_;
        bVar67 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar106._8_4_ = bVar67 * uVar121 | !bVar67 * auVar106._8_4_;
        bVar67 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar106._12_4_ = bVar67 * uVar122 | !bVar67 * auVar106._12_4_;
        bVar67 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar106._16_4_ = bVar67 * uVar123 | !bVar67 * auVar106._16_4_;
        bVar67 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar106._20_4_ = bVar67 * uVar124 | !bVar67 * auVar106._20_4_;
        bVar67 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar106._24_4_ = bVar67 * uVar125 | !bVar67 * auVar106._24_4_;
        bVar67 = SUB81(uVar70 >> 7,0);
        auVar106._28_4_ = bVar67 * uVar126 | !bVar67 * auVar106._28_4_;
        auVar85 = vblendmps_avx512vl(auVar93,auVar85);
        bVar67 = (bool)((byte)(uVar65 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar65 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar65 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar65 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar65 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar65 >> 6) & 1);
        bVar12 = SUB81(uVar65 >> 7,0);
        auVar107._0_4_ =
             (uint)(bVar63 & 1) *
             ((uint)(bVar64 & 1) * auVar85._0_4_ | !(bool)(bVar64 & 1) * uVar71) |
             !(bool)(bVar63 & 1) * auVar107._0_4_;
        bVar6 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar107._4_4_ =
             (uint)bVar6 * ((uint)bVar67 * auVar85._4_4_ | !bVar67 * uVar120) |
             !bVar6 * auVar107._4_4_;
        bVar67 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar107._8_4_ =
             (uint)bVar67 * ((uint)bVar7 * auVar85._8_4_ | !bVar7 * uVar121) |
             !bVar67 * auVar107._8_4_;
        bVar67 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar107._12_4_ =
             (uint)bVar67 * ((uint)bVar8 * auVar85._12_4_ | !bVar8 * uVar122) |
             !bVar67 * auVar107._12_4_;
        bVar67 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar107._16_4_ =
             (uint)bVar67 * ((uint)bVar9 * auVar85._16_4_ | !bVar9 * uVar123) |
             !bVar67 * auVar107._16_4_;
        bVar67 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar107._20_4_ =
             (uint)bVar67 * ((uint)bVar10 * auVar85._20_4_ | !bVar10 * uVar124) |
             !bVar67 * auVar107._20_4_;
        bVar67 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar107._24_4_ =
             (uint)bVar67 * ((uint)bVar11 * auVar85._24_4_ | !bVar11 * uVar125) |
             !bVar67 * auVar107._24_4_;
        bVar67 = SUB81(uVar70 >> 7,0);
        auVar107._28_4_ =
             (uint)bVar67 * ((uint)bVar12 * auVar85._28_4_ | !bVar12 * uVar126) |
             !bVar67 * auVar107._28_4_;
        bVar60 = (~bVar63 | bVar64) & bVar60;
      }
      if ((bVar60 & 0x7f) == 0) {
        auVar98._8_4_ = 0x3f800000;
        auVar98._0_8_ = 0x3f8000003f800000;
        auVar98._12_4_ = 0x3f800000;
        auVar98._16_4_ = 0x3f800000;
        auVar98._20_4_ = 0x3f800000;
        auVar98._24_4_ = 0x3f800000;
        auVar98._28_4_ = 0x3f800000;
        goto LAB_01a71263;
      }
      auVar93 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar95 = vxorps_avx512vl(auVar95,auVar93);
      auVar83 = vxorps_avx512vl(auVar83,auVar93);
      auVar94 = vxorps_avx512vl(auVar94,auVar93);
      auVar74 = vsubss_avx512f(ZEXT416((uint)(ray->org).field_0.m128[3]),local_520);
      auVar85 = vbroadcastss_avx512vl(auVar74);
      auVar85 = vmaxps_avx512vl(auVar85,auVar106);
      auVar74 = vsubss_avx512f(ZEXT416((uint)ray->tfar),local_520);
      auVar82 = vbroadcastss_avx512vl(auVar74);
      auVar82 = vminps_avx512vl(auVar82,auVar107);
      auVar99 = vmulps_avx512vl(auVar99,auVar228);
      auVar97 = vfmadd213ps_avx512vl(auVar97,auVar227,auVar99);
      auVar74 = vfmadd213ps_fma(auVar96,auVar173,auVar97);
      auVar96 = vmulps_avx512vl(local_760,auVar228);
      auVar75 = vfmadd231ps_fma(auVar96,auVar227,local_6c0);
      auVar236 = ZEXT3264(local_720);
      auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),local_720,auVar173);
      auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar96,auVar97);
      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar14 = vcmpps_avx512vl(auVar97,auVar99,1);
      auVar101 = vxorps_avx512vl(ZEXT1632(auVar74),auVar93);
      auVar104 = vrcp14ps_avx512vl(auVar96);
      auVar108 = vxorps_avx512vl(auVar96,auVar93);
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar109 = vfnmadd213ps_avx512vl(auVar104,auVar96,auVar98);
      auVar74 = vfmadd132ps_fma(auVar109,auVar104,auVar104);
      fVar141 = auVar74._0_4_ * auVar101._0_4_;
      fVar127 = auVar74._4_4_ * auVar101._4_4_;
      auVar49._4_4_ = fVar127;
      auVar49._0_4_ = fVar141;
      fVar151 = auVar74._8_4_ * auVar101._8_4_;
      auVar49._8_4_ = fVar151;
      fVar152 = auVar74._12_4_ * auVar101._12_4_;
      auVar49._12_4_ = fVar152;
      fVar154 = auVar101._16_4_ * 0.0;
      auVar49._16_4_ = fVar154;
      fVar153 = auVar101._20_4_ * 0.0;
      auVar49._20_4_ = fVar153;
      fVar155 = auVar101._24_4_ * 0.0;
      auVar49._24_4_ = fVar155;
      auVar49._28_4_ = auVar101._28_4_;
      uVar16 = vcmpps_avx512vl(auVar96,auVar108,1);
      bVar63 = (byte)uVar14 | (byte)uVar16;
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar110 = vblendmps_avx512vl(auVar49,auVar109);
      auVar111._0_4_ =
           (uint)(bVar63 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar104._0_4_;
      bVar67 = (bool)(bVar63 >> 1 & 1);
      auVar111._4_4_ = (uint)bVar67 * auVar110._4_4_ | (uint)!bVar67 * auVar104._4_4_;
      bVar67 = (bool)(bVar63 >> 2 & 1);
      auVar111._8_4_ = (uint)bVar67 * auVar110._8_4_ | (uint)!bVar67 * auVar104._8_4_;
      bVar67 = (bool)(bVar63 >> 3 & 1);
      auVar111._12_4_ = (uint)bVar67 * auVar110._12_4_ | (uint)!bVar67 * auVar104._12_4_;
      bVar67 = (bool)(bVar63 >> 4 & 1);
      auVar111._16_4_ = (uint)bVar67 * auVar110._16_4_ | (uint)!bVar67 * auVar104._16_4_;
      bVar67 = (bool)(bVar63 >> 5 & 1);
      auVar111._20_4_ = (uint)bVar67 * auVar110._20_4_ | (uint)!bVar67 * auVar104._20_4_;
      bVar67 = (bool)(bVar63 >> 6 & 1);
      auVar111._24_4_ = (uint)bVar67 * auVar110._24_4_ | (uint)!bVar67 * auVar104._24_4_;
      auVar111._28_4_ =
           (uint)(bVar63 >> 7) * auVar110._28_4_ | (uint)!(bool)(bVar63 >> 7) * auVar104._28_4_;
      auVar104 = vmaxps_avx512vl(auVar85,auVar111);
      uVar16 = vcmpps_avx512vl(auVar96,auVar108,6);
      bVar63 = (byte)uVar14 | (byte)uVar16;
      auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar112._0_4_ = (uint)(bVar63 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar63 & 1) * (int)fVar141
      ;
      bVar67 = (bool)(bVar63 >> 1 & 1);
      auVar112._4_4_ = (uint)bVar67 * auVar96._4_4_ | (uint)!bVar67 * (int)fVar127;
      bVar67 = (bool)(bVar63 >> 2 & 1);
      auVar112._8_4_ = (uint)bVar67 * auVar96._8_4_ | (uint)!bVar67 * (int)fVar151;
      bVar67 = (bool)(bVar63 >> 3 & 1);
      auVar112._12_4_ = (uint)bVar67 * auVar96._12_4_ | (uint)!bVar67 * (int)fVar152;
      bVar67 = (bool)(bVar63 >> 4 & 1);
      auVar112._16_4_ = (uint)bVar67 * auVar96._16_4_ | (uint)!bVar67 * (int)fVar154;
      bVar67 = (bool)(bVar63 >> 5 & 1);
      auVar112._20_4_ = (uint)bVar67 * auVar96._20_4_ | (uint)!bVar67 * (int)fVar153;
      bVar67 = (bool)(bVar63 >> 6 & 1);
      auVar112._24_4_ = (uint)bVar67 * auVar96._24_4_ | (uint)!bVar67 * (int)fVar155;
      auVar112._28_4_ =
           (uint)(bVar63 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar63 >> 7) * auVar101._28_4_;
      auVar82 = vminps_avx512vl(auVar82,auVar112);
      auVar85 = vsubps_avx(ZEXT832(0) << 0x20,auVar90);
      auVar90 = vsubps_avx(ZEXT832(0) << 0x20,auVar91);
      auVar101 = ZEXT832(0) << 0x20;
      auVar91 = vsubps_avx(auVar101,auVar92);
      auVar91 = vmulps_avx512vl(auVar91,auVar95);
      auVar90 = vfmadd231ps_avx512vl(auVar91,auVar94,auVar90);
      auVar85 = vfmadd231ps_avx512vl(auVar90,auVar83,auVar85);
      auVar90 = vmulps_avx512vl(local_760,auVar95);
      auVar239 = ZEXT3264(local_6c0);
      auVar90 = vfmadd231ps_avx512vl(auVar90,local_6c0,auVar94);
      auVar90 = vfmadd231ps_avx512vl(auVar90,local_720,auVar83);
      vandps_avx512vl(auVar90,auVar97);
      uVar14 = vcmpps_avx512vl(auVar90,auVar99,1);
      auVar85 = vxorps_avx512vl(auVar85,auVar93);
      auVar91 = vrcp14ps_avx512vl(auVar90);
      auVar92 = vxorps_avx512vl(auVar90,auVar93);
      auVar93 = vfnmadd213ps_avx512vl(auVar91,auVar90,auVar98);
      auVar74 = vfmadd132ps_fma(auVar93,auVar91,auVar91);
      fVar141 = auVar74._0_4_ * auVar85._0_4_;
      fVar127 = auVar74._4_4_ * auVar85._4_4_;
      auVar50._4_4_ = fVar127;
      auVar50._0_4_ = fVar141;
      fVar151 = auVar74._8_4_ * auVar85._8_4_;
      auVar50._8_4_ = fVar151;
      fVar152 = auVar74._12_4_ * auVar85._12_4_;
      auVar50._12_4_ = fVar152;
      fVar154 = auVar85._16_4_ * 0.0;
      auVar50._16_4_ = fVar154;
      fVar153 = auVar85._20_4_ * 0.0;
      auVar50._20_4_ = fVar153;
      fVar155 = auVar85._24_4_ * 0.0;
      auVar50._24_4_ = fVar155;
      auVar50._28_4_ = auVar85._28_4_;
      uVar16 = vcmpps_avx512vl(auVar90,auVar92,1);
      bVar63 = (byte)uVar14 | (byte)uVar16;
      auVar93 = vblendmps_avx512vl(auVar50,auVar109);
      auVar113._0_4_ =
           (uint)(bVar63 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar91._0_4_;
      bVar67 = (bool)(bVar63 >> 1 & 1);
      auVar113._4_4_ = (uint)bVar67 * auVar93._4_4_ | (uint)!bVar67 * auVar91._4_4_;
      bVar67 = (bool)(bVar63 >> 2 & 1);
      auVar113._8_4_ = (uint)bVar67 * auVar93._8_4_ | (uint)!bVar67 * auVar91._8_4_;
      bVar67 = (bool)(bVar63 >> 3 & 1);
      auVar113._12_4_ = (uint)bVar67 * auVar93._12_4_ | (uint)!bVar67 * auVar91._12_4_;
      bVar67 = (bool)(bVar63 >> 4 & 1);
      auVar113._16_4_ = (uint)bVar67 * auVar93._16_4_ | (uint)!bVar67 * auVar91._16_4_;
      bVar67 = (bool)(bVar63 >> 5 & 1);
      auVar113._20_4_ = (uint)bVar67 * auVar93._20_4_ | (uint)!bVar67 * auVar91._20_4_;
      bVar67 = (bool)(bVar63 >> 6 & 1);
      auVar113._24_4_ = (uint)bVar67 * auVar93._24_4_ | (uint)!bVar67 * auVar91._24_4_;
      auVar113._28_4_ =
           (uint)(bVar63 >> 7) * auVar93._28_4_ | (uint)!(bool)(bVar63 >> 7) * auVar91._28_4_;
      local_320 = vmaxps_avx512vl(auVar104,auVar113);
      uVar16 = vcmpps_avx512vl(auVar90,auVar92,6);
      bVar63 = (byte)uVar14 | (byte)uVar16;
      auVar114._0_4_ = (uint)(bVar63 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar63 & 1) * (int)fVar141
      ;
      bVar67 = (bool)(bVar63 >> 1 & 1);
      auVar114._4_4_ = (uint)bVar67 * auVar96._4_4_ | (uint)!bVar67 * (int)fVar127;
      bVar67 = (bool)(bVar63 >> 2 & 1);
      auVar114._8_4_ = (uint)bVar67 * auVar96._8_4_ | (uint)!bVar67 * (int)fVar151;
      bVar67 = (bool)(bVar63 >> 3 & 1);
      auVar114._12_4_ = (uint)bVar67 * auVar96._12_4_ | (uint)!bVar67 * (int)fVar152;
      bVar67 = (bool)(bVar63 >> 4 & 1);
      auVar114._16_4_ = (uint)bVar67 * auVar96._16_4_ | (uint)!bVar67 * (int)fVar154;
      bVar67 = (bool)(bVar63 >> 5 & 1);
      auVar114._20_4_ = (uint)bVar67 * auVar96._20_4_ | (uint)!bVar67 * (int)fVar153;
      bVar67 = (bool)(bVar63 >> 6 & 1);
      auVar114._24_4_ = (uint)bVar67 * auVar96._24_4_ | (uint)!bVar67 * (int)fVar155;
      auVar114._28_4_ =
           (uint)(bVar63 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar63 >> 7) * auVar85._28_4_;
      local_2a0 = vminps_avx(auVar82,auVar114);
      uVar14 = vcmpps_avx512vl(local_320,local_2a0,2);
      bVar60 = bVar60 & 0x7f & (byte)uVar14;
      if (bVar60 == 0) goto LAB_01a71263;
      auVar85 = vmaxps_avx(auVar101,local_5c0);
      auVar90 = vfmadd213ps_avx512vl(auVar105,auVar102,auVar86);
      auVar90 = vmulps_avx512vl(auVar84,auVar90);
      auVar91 = vfmadd213ps_avx512vl(local_5a0,auVar102,auVar86);
      fVar141 = auVar84._0_4_;
      fVar127 = auVar84._4_4_;
      auVar51._4_4_ = fVar127 * auVar91._4_4_;
      auVar51._0_4_ = fVar141 * auVar91._0_4_;
      fVar151 = auVar84._8_4_;
      auVar51._8_4_ = fVar151 * auVar91._8_4_;
      fVar152 = auVar84._12_4_;
      auVar51._12_4_ = fVar152 * auVar91._12_4_;
      fVar154 = auVar84._16_4_;
      auVar51._16_4_ = fVar154 * auVar91._16_4_;
      fVar153 = auVar84._20_4_;
      auVar51._20_4_ = fVar153 * auVar91._20_4_;
      fVar155 = auVar84._24_4_;
      auVar51._24_4_ = fVar155 * auVar91._24_4_;
      auVar51._28_4_ = auVar113._28_4_;
      auVar90 = vminps_avx512vl(auVar90,auVar98);
      auVar91 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar90 = vmaxps_avx(auVar90,ZEXT832(0) << 0x20);
      auVar92 = vminps_avx512vl(auVar51,auVar98);
      auVar52._4_4_ = (auVar90._4_4_ + 1.0) * 0.125;
      auVar52._0_4_ = (auVar90._0_4_ + 0.0) * 0.125;
      auVar52._8_4_ = (auVar90._8_4_ + 2.0) * 0.125;
      auVar52._12_4_ = (auVar90._12_4_ + 3.0) * 0.125;
      auVar52._16_4_ = (auVar90._16_4_ + 4.0) * 0.125;
      auVar52._20_4_ = (auVar90._20_4_ + 5.0) * 0.125;
      auVar52._24_4_ = (auVar90._24_4_ + 6.0) * 0.125;
      auVar52._28_4_ = auVar90._28_4_ + 7.0;
      local_1a0 = vfmadd213ps_avx512vl(auVar52,local_900,_local_8e0);
      auVar90 = vmaxps_avx(auVar92,ZEXT832(0) << 0x20);
      auVar53._4_4_ = (auVar90._4_4_ + 1.0) * 0.125;
      auVar53._0_4_ = (auVar90._0_4_ + 0.0) * 0.125;
      auVar53._8_4_ = (auVar90._8_4_ + 2.0) * 0.125;
      auVar53._12_4_ = (auVar90._12_4_ + 3.0) * 0.125;
      auVar53._16_4_ = (auVar90._16_4_ + 4.0) * 0.125;
      auVar53._20_4_ = (auVar90._20_4_ + 5.0) * 0.125;
      auVar53._24_4_ = (auVar90._24_4_ + 6.0) * 0.125;
      auVar53._28_4_ = auVar90._28_4_ + 7.0;
      local_1c0 = vfmadd213ps_avx512vl(auVar53,local_900,_local_8e0);
      auVar54._4_4_ = auVar85._4_4_ * auVar85._4_4_;
      auVar54._0_4_ = auVar85._0_4_ * auVar85._0_4_;
      auVar54._8_4_ = auVar85._8_4_ * auVar85._8_4_;
      auVar54._12_4_ = auVar85._12_4_ * auVar85._12_4_;
      auVar54._16_4_ = auVar85._16_4_ * auVar85._16_4_;
      auVar54._20_4_ = auVar85._20_4_ * auVar85._20_4_;
      auVar54._24_4_ = auVar85._24_4_ * auVar85._24_4_;
      auVar54._28_4_ = auVar85._28_4_;
      auVar90 = vsubps_avx(local_540,auVar54);
      auVar55._4_4_ = auVar90._4_4_ * (float)local_3c0._4_4_;
      auVar55._0_4_ = auVar90._0_4_ * (float)local_3c0._0_4_;
      auVar55._8_4_ = auVar90._8_4_ * fStack_3b8;
      auVar55._12_4_ = auVar90._12_4_ * fStack_3b4;
      auVar55._16_4_ = auVar90._16_4_ * fStack_3b0;
      auVar55._20_4_ = auVar90._20_4_ * fStack_3ac;
      auVar55._24_4_ = auVar90._24_4_ * fStack_3a8;
      auVar55._28_4_ = auVar85._28_4_;
      auVar85 = vsubps_avx(local_3a0,auVar55);
      uVar14 = vcmpps_avx512vl(auVar85,ZEXT832(0) << 0x20,5);
      bVar63 = (byte)uVar14;
      if (bVar63 == 0) {
        bVar63 = 0;
        auVar85 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar225 = ZEXT864(0) << 0x20;
        auVar92 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar93 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar220 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar115._8_4_ = 0x7f800000;
        auVar115._0_8_ = 0x7f8000007f800000;
        auVar115._12_4_ = 0x7f800000;
        auVar115._16_4_ = 0x7f800000;
        auVar115._20_4_ = 0x7f800000;
        auVar115._24_4_ = 0x7f800000;
        auVar115._28_4_ = 0x7f800000;
        auVar116._8_4_ = 0xff800000;
        auVar116._0_8_ = 0xff800000ff800000;
        auVar116._12_4_ = 0xff800000;
        auVar116._16_4_ = 0xff800000;
        auVar116._20_4_ = 0xff800000;
        auVar116._24_4_ = 0xff800000;
        auVar116._28_4_ = 0xff800000;
      }
      else {
        auVar75 = vxorps_avx512vl(auVar203,auVar203);
        uVar70 = vcmpps_avx512vl(auVar85,auVar101,5);
        auVar85 = vsqrtps_avx(auVar85);
        auVar91 = vfnmadd213ps_avx512vl(auVar103,local_560,auVar98);
        auVar93 = vfmadd132ps_avx512vl(auVar91,local_560,local_560);
        auVar91 = vsubps_avx(local_3e0,auVar85);
        auVar83 = vmulps_avx512vl(auVar91,auVar93);
        auVar85 = vsubps_avx512vl(auVar85,auVar100);
        auVar94 = vmulps_avx512vl(auVar85,auVar93);
        auVar85 = vfmadd213ps_avx512vl(auVar102,auVar83,auVar86);
        auVar56._4_4_ = fVar127 * auVar85._4_4_;
        auVar56._0_4_ = fVar141 * auVar85._0_4_;
        auVar56._8_4_ = fVar151 * auVar85._8_4_;
        auVar56._12_4_ = fVar152 * auVar85._12_4_;
        auVar56._16_4_ = fVar154 * auVar85._16_4_;
        auVar56._20_4_ = fVar153 * auVar85._20_4_;
        auVar56._24_4_ = fVar155 * auVar85._24_4_;
        auVar56._28_4_ = auVar92._28_4_;
        auVar85 = vmulps_avx512vl(local_720,auVar83);
        auVar91 = vmulps_avx512vl(local_6c0,auVar83);
        auVar95 = vmulps_avx512vl(local_760,auVar83);
        auVar92 = vfmadd213ps_avx512vl(auVar87,auVar56,auVar198);
        auVar92 = vsubps_avx512vl(auVar85,auVar92);
        auVar85 = vfmadd213ps_avx512vl(auVar88,auVar56,auVar89);
        auVar93 = vsubps_avx512vl(auVar91,auVar85);
        auVar74 = vfmadd213ps_fma(auVar56,auVar81,local_580);
        auVar85 = vsubps_avx(auVar95,ZEXT1632(auVar74));
        auVar220 = auVar85._0_28_;
        auVar85 = vfmadd213ps_avx512vl(auVar102,auVar94,auVar86);
        auVar57._4_4_ = fVar127 * auVar85._4_4_;
        auVar57._0_4_ = fVar141 * auVar85._0_4_;
        auVar57._8_4_ = fVar151 * auVar85._8_4_;
        auVar57._12_4_ = fVar152 * auVar85._12_4_;
        auVar57._16_4_ = fVar154 * auVar85._16_4_;
        auVar57._20_4_ = fVar153 * auVar85._20_4_;
        auVar57._24_4_ = fVar155 * auVar85._24_4_;
        auVar57._28_4_ = auVar84._28_4_;
        auVar85 = vmulps_avx512vl(local_720,auVar94);
        auVar84 = vmulps_avx512vl(local_6c0,auVar94);
        auVar86 = vmulps_avx512vl(local_760,auVar94);
        auVar74 = vfmadd213ps_fma(auVar87,auVar57,auVar198);
        auVar91 = vsubps_avx(auVar85,ZEXT1632(auVar74));
        auVar74 = vfmadd213ps_fma(auVar88,auVar57,auVar89);
        auVar85 = vsubps_avx(auVar84,ZEXT1632(auVar74));
        auVar74 = vfmadd213ps_fma(auVar81,auVar57,local_580);
        auVar84 = vsubps_avx512vl(auVar86,ZEXT1632(auVar74));
        auVar225 = ZEXT3264(auVar84);
        auVar174._8_4_ = 0x7f800000;
        auVar174._0_8_ = 0x7f8000007f800000;
        auVar174._12_4_ = 0x7f800000;
        auVar174._16_4_ = 0x7f800000;
        auVar174._20_4_ = 0x7f800000;
        auVar174._24_4_ = 0x7f800000;
        auVar174._28_4_ = 0x7f800000;
        auVar84 = vblendmps_avx512vl(auVar174,auVar83);
        bVar67 = (bool)((byte)uVar70 & 1);
        auVar115._0_4_ = (uint)bVar67 * auVar84._0_4_ | (uint)!bVar67 * 0x7f800000;
        bVar67 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar115._4_4_ = (uint)bVar67 * auVar84._4_4_ | (uint)!bVar67 * 0x7f800000;
        bVar67 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar115._8_4_ = (uint)bVar67 * auVar84._8_4_ | (uint)!bVar67 * 0x7f800000;
        bVar67 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar115._12_4_ = (uint)bVar67 * auVar84._12_4_ | (uint)!bVar67 * 0x7f800000;
        bVar67 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar115._16_4_ = (uint)bVar67 * auVar84._16_4_ | (uint)!bVar67 * 0x7f800000;
        bVar67 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar115._20_4_ = (uint)bVar67 * auVar84._20_4_ | (uint)!bVar67 * 0x7f800000;
        bVar67 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar115._24_4_ = (uint)bVar67 * auVar84._24_4_ | (uint)!bVar67 * 0x7f800000;
        bVar67 = SUB81(uVar70 >> 7,0);
        auVar115._28_4_ = (uint)bVar67 * auVar84._28_4_ | (uint)!bVar67 * 0x7f800000;
        auVar199._8_4_ = 0xff800000;
        auVar199._0_8_ = 0xff800000ff800000;
        auVar199._12_4_ = 0xff800000;
        auVar199._16_4_ = 0xff800000;
        auVar199._20_4_ = 0xff800000;
        auVar199._24_4_ = 0xff800000;
        auVar199._28_4_ = 0xff800000;
        auVar84 = vblendmps_avx512vl(auVar199,auVar94);
        bVar67 = (bool)((byte)uVar70 & 1);
        auVar116._0_4_ = (uint)bVar67 * auVar84._0_4_ | (uint)!bVar67 * -0x800000;
        bVar67 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar116._4_4_ = (uint)bVar67 * auVar84._4_4_ | (uint)!bVar67 * -0x800000;
        bVar67 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar116._8_4_ = (uint)bVar67 * auVar84._8_4_ | (uint)!bVar67 * -0x800000;
        bVar67 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar116._12_4_ = (uint)bVar67 * auVar84._12_4_ | (uint)!bVar67 * -0x800000;
        bVar67 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar116._16_4_ = (uint)bVar67 * auVar84._16_4_ | (uint)!bVar67 * -0x800000;
        bVar67 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar116._20_4_ = (uint)bVar67 * auVar84._20_4_ | (uint)!bVar67 * -0x800000;
        bVar67 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar116._24_4_ = (uint)bVar67 * auVar84._24_4_ | (uint)!bVar67 * -0x800000;
        bVar67 = SUB81(uVar70 >> 7,0);
        auVar116._28_4_ = (uint)bVar67 * auVar84._28_4_ | (uint)!bVar67 * -0x800000;
        auVar36._8_4_ = 0x36000000;
        auVar36._0_8_ = 0x3600000036000000;
        auVar36._12_4_ = 0x36000000;
        auVar36._16_4_ = 0x36000000;
        auVar36._20_4_ = 0x36000000;
        auVar36._24_4_ = 0x36000000;
        auVar36._28_4_ = 0x36000000;
        auVar84 = vmulps_avx512vl(local_400,auVar36);
        uVar65 = vcmpps_avx512vl(auVar84,local_420,0xe);
        uVar70 = uVar70 & uVar65;
        bVar64 = (byte)uVar70;
        if (bVar64 != 0) {
          uVar65 = vcmpps_avx512vl(auVar90,ZEXT1632(auVar75),2);
          auVar216._8_4_ = 0x7f800000;
          auVar216._0_8_ = 0x7f8000007f800000;
          auVar216._12_4_ = 0x7f800000;
          auVar216._16_4_ = 0x7f800000;
          auVar216._20_4_ = 0x7f800000;
          auVar216._24_4_ = 0x7f800000;
          auVar216._28_4_ = 0x7f800000;
          auVar224._8_4_ = 0xff800000;
          auVar224._0_8_ = 0xff800000ff800000;
          auVar224._12_4_ = 0xff800000;
          auVar224._16_4_ = 0xff800000;
          auVar224._20_4_ = 0xff800000;
          auVar224._24_4_ = 0xff800000;
          auVar224._28_4_ = 0xff800000;
          auVar86 = vblendmps_avx512vl(auVar216,auVar224);
          bVar61 = (byte)uVar65;
          uVar71 = (uint)(bVar61 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar84._0_4_;
          bVar67 = (bool)((byte)(uVar65 >> 1) & 1);
          uVar120 = (uint)bVar67 * auVar86._4_4_ | (uint)!bVar67 * auVar84._4_4_;
          bVar67 = (bool)((byte)(uVar65 >> 2) & 1);
          uVar121 = (uint)bVar67 * auVar86._8_4_ | (uint)!bVar67 * auVar84._8_4_;
          bVar67 = (bool)((byte)(uVar65 >> 3) & 1);
          uVar122 = (uint)bVar67 * auVar86._12_4_ | (uint)!bVar67 * auVar84._12_4_;
          bVar67 = (bool)((byte)(uVar65 >> 4) & 1);
          uVar123 = (uint)bVar67 * auVar86._16_4_ | (uint)!bVar67 * auVar84._16_4_;
          bVar67 = (bool)((byte)(uVar65 >> 5) & 1);
          uVar124 = (uint)bVar67 * auVar86._20_4_ | (uint)!bVar67 * auVar84._20_4_;
          bVar67 = (bool)((byte)(uVar65 >> 6) & 1);
          uVar125 = (uint)bVar67 * auVar86._24_4_ | (uint)!bVar67 * auVar84._24_4_;
          bVar67 = SUB81(uVar65 >> 7,0);
          uVar126 = (uint)bVar67 * auVar86._28_4_ | (uint)!bVar67 * auVar84._28_4_;
          auVar115._0_4_ = (bVar64 & 1) * uVar71 | !(bool)(bVar64 & 1) * auVar115._0_4_;
          bVar67 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar115._4_4_ = bVar67 * uVar120 | !bVar67 * auVar115._4_4_;
          bVar67 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar115._8_4_ = bVar67 * uVar121 | !bVar67 * auVar115._8_4_;
          bVar67 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar115._12_4_ = bVar67 * uVar122 | !bVar67 * auVar115._12_4_;
          bVar67 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar115._16_4_ = bVar67 * uVar123 | !bVar67 * auVar115._16_4_;
          bVar67 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar115._20_4_ = bVar67 * uVar124 | !bVar67 * auVar115._20_4_;
          bVar67 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar115._24_4_ = bVar67 * uVar125 | !bVar67 * auVar115._24_4_;
          bVar67 = SUB81(uVar70 >> 7,0);
          auVar115._28_4_ = bVar67 * uVar126 | !bVar67 * auVar115._28_4_;
          auVar84 = vblendmps_avx512vl(auVar224,auVar216);
          bVar67 = (bool)((byte)(uVar65 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar65 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar65 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar65 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar65 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar65 >> 6) & 1);
          bVar12 = SUB81(uVar65 >> 7,0);
          auVar116._0_4_ =
               (uint)(bVar64 & 1) *
               ((uint)(bVar61 & 1) * auVar84._0_4_ | !(bool)(bVar61 & 1) * uVar71) |
               !(bool)(bVar64 & 1) * auVar116._0_4_;
          bVar6 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar116._4_4_ =
               (uint)bVar6 * ((uint)bVar67 * auVar84._4_4_ | !bVar67 * uVar120) |
               !bVar6 * auVar116._4_4_;
          bVar67 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar116._8_4_ =
               (uint)bVar67 * ((uint)bVar7 * auVar84._8_4_ | !bVar7 * uVar121) |
               !bVar67 * auVar116._8_4_;
          bVar67 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar116._12_4_ =
               (uint)bVar67 * ((uint)bVar8 * auVar84._12_4_ | !bVar8 * uVar122) |
               !bVar67 * auVar116._12_4_;
          bVar67 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar116._16_4_ =
               (uint)bVar67 * ((uint)bVar9 * auVar84._16_4_ | !bVar9 * uVar123) |
               !bVar67 * auVar116._16_4_;
          bVar67 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar116._20_4_ =
               (uint)bVar67 * ((uint)bVar10 * auVar84._20_4_ | !bVar10 * uVar124) |
               !bVar67 * auVar116._20_4_;
          bVar67 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar116._24_4_ =
               (uint)bVar67 * ((uint)bVar11 * auVar84._24_4_ | !bVar11 * uVar125) |
               !bVar67 * auVar116._24_4_;
          bVar67 = SUB81(uVar70 >> 7,0);
          auVar116._28_4_ =
               (uint)bVar67 * ((uint)bVar12 * auVar84._28_4_ | !bVar12 * uVar126) |
               !bVar67 * auVar116._28_4_;
          bVar63 = (~bVar64 | bVar61) & bVar63;
        }
      }
      auVar238 = ZEXT3264(local_760);
      auVar242 = ZEXT3264(local_780);
      auVar229 = ZEXT3264(local_7a0);
      auVar230 = ZEXT3264(local_7c0);
      auVar231 = ZEXT3264(local_7e0);
      auVar232 = ZEXT3264(local_800);
      auVar233 = ZEXT3264(local_820);
      auVar234 = ZEXT3264(local_840);
      auVar235 = ZEXT3264(local_860);
      auVar237 = ZEXT3264(local_880);
      auVar240 = ZEXT3264(local_8a0);
      auVar241 = ZEXT3264(local_8c0);
      uVar128 = *(undefined4 *)&(ray->dir).field_0;
      auVar212._4_4_ = uVar128;
      auVar212._0_4_ = uVar128;
      auVar212._8_4_ = uVar128;
      auVar212._12_4_ = uVar128;
      auVar212._16_4_ = uVar128;
      auVar212._20_4_ = uVar128;
      auVar212._24_4_ = uVar128;
      auVar212._28_4_ = uVar128;
      uVar128 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      auVar217._4_4_ = uVar128;
      auVar217._0_4_ = uVar128;
      auVar217._8_4_ = uVar128;
      auVar217._12_4_ = uVar128;
      auVar217._16_4_ = uVar128;
      auVar217._20_4_ = uVar128;
      auVar217._24_4_ = uVar128;
      auVar217._28_4_ = uVar128;
      fVar141 = (ray->dir).field_0.m128[2];
      auVar213._0_4_ = fVar141 * auVar225._0_4_;
      auVar213._4_4_ = fVar141 * auVar225._4_4_;
      auVar213._8_4_ = fVar141 * auVar225._8_4_;
      auVar213._12_4_ = fVar141 * auVar225._12_4_;
      auVar213._16_4_ = fVar141 * auVar225._16_4_;
      auVar213._20_4_ = fVar141 * auVar225._20_4_;
      auVar213._28_36_ = auVar225._28_36_;
      auVar213._24_4_ = fVar141 * auVar225._24_4_;
      auVar74 = vfmadd231ps_fma(auVar213._0_32_,auVar217,auVar85);
      auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar212,auVar91);
      auVar222._8_4_ = 0x7fffffff;
      auVar222._0_8_ = 0x7fffffff7fffffff;
      auVar222._12_4_ = 0x7fffffff;
      auVar222._16_4_ = 0x7fffffff;
      auVar222._20_4_ = 0x7fffffff;
      auVar222._24_4_ = 0x7fffffff;
      auVar222._28_4_ = 0x7fffffff;
      auVar85 = vandps_avx(auVar222,ZEXT1632(auVar74));
      _local_280 = local_320;
      auVar209._8_4_ = 0x3e99999a;
      auVar209._0_8_ = 0x3e99999a3e99999a;
      auVar209._12_4_ = 0x3e99999a;
      auVar209._16_4_ = 0x3e99999a;
      auVar209._20_4_ = 0x3e99999a;
      auVar209._24_4_ = 0x3e99999a;
      auVar209._28_4_ = 0x3e99999a;
      uVar14 = vcmpps_avx512vl(auVar85,auVar209,1);
      _local_360 = vmaxps_avx512vl(local_320,auVar116);
      auVar85 = vminps_avx(local_2a0,auVar115);
      uVar16 = vcmpps_avx512vl(local_320,auVar85,2);
      bVar64 = (byte)uVar16 & bVar60;
      uVar15 = vcmpps_avx512vl(_local_360,local_2a0,2);
      if ((bVar60 & ((byte)uVar15 | (byte)uVar16)) == 0) {
        auVar225 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar221 = ZEXT3264(local_5e0);
        auVar223 = ZEXT3264(local_600);
        auVar218 = ZEXT3264(local_620);
        auVar200 = ZEXT3264(local_4c0);
        auVar213 = ZEXT3264(local_640);
      }
      else {
        local_728 = (uint)(byte)((byte)uVar14 | ~bVar63);
        auVar58._4_4_ = auVar220._4_4_ * fVar141;
        auVar58._0_4_ = auVar220._0_4_ * fVar141;
        auVar58._8_4_ = auVar220._8_4_ * fVar141;
        auVar58._12_4_ = auVar220._12_4_ * fVar141;
        auVar58._16_4_ = auVar220._16_4_ * fVar141;
        auVar58._20_4_ = auVar220._20_4_ * fVar141;
        auVar58._24_4_ = auVar220._24_4_ * fVar141;
        auVar58._28_4_ = auVar85._28_4_;
        auVar74 = vfmadd213ps_fma(auVar93,auVar217,auVar58);
        auVar74 = vfmadd213ps_fma(auVar92,auVar212,ZEXT1632(auVar74));
        auVar85 = vandps_avx(auVar222,ZEXT1632(auVar74));
        uVar14 = vcmpps_avx512vl(auVar85,auVar209,1);
        bVar63 = (byte)uVar14 | ~bVar63;
        auVar138._8_4_ = 2;
        auVar138._0_8_ = 0x200000002;
        auVar138._12_4_ = 2;
        auVar138._16_4_ = 2;
        auVar138._20_4_ = 2;
        auVar138._24_4_ = 2;
        auVar138._28_4_ = 2;
        auVar37._8_4_ = 3;
        auVar37._0_8_ = 0x300000003;
        auVar37._12_4_ = 3;
        auVar37._16_4_ = 3;
        auVar37._20_4_ = 3;
        auVar37._24_4_ = 3;
        auVar37._28_4_ = 3;
        auVar85 = vpblendmd_avx512vl(auVar138,auVar37);
        local_240._0_4_ = (uint)(bVar63 & 1) * auVar85._0_4_ | (uint)!(bool)(bVar63 & 1) * 2;
        bVar67 = (bool)(bVar63 >> 1 & 1);
        local_240._4_4_ = (uint)bVar67 * auVar85._4_4_ | (uint)!bVar67 * 2;
        bVar67 = (bool)(bVar63 >> 2 & 1);
        local_240._8_4_ = (uint)bVar67 * auVar85._8_4_ | (uint)!bVar67 * 2;
        bVar67 = (bool)(bVar63 >> 3 & 1);
        local_240._12_4_ = (uint)bVar67 * auVar85._12_4_ | (uint)!bVar67 * 2;
        bVar67 = (bool)(bVar63 >> 4 & 1);
        local_240._16_4_ = (uint)bVar67 * auVar85._16_4_ | (uint)!bVar67 * 2;
        bVar67 = (bool)(bVar63 >> 5 & 1);
        local_240._20_4_ = (uint)bVar67 * auVar85._20_4_ | (uint)!bVar67 * 2;
        bVar67 = (bool)(bVar63 >> 6 & 1);
        local_240._24_4_ = (uint)bVar67 * auVar85._24_4_ | (uint)!bVar67 * 2;
        local_240._28_4_ = (uint)(bVar63 >> 7) * auVar85._28_4_ | (uint)!(bool)(bVar63 >> 7) * 2;
        local_2e0 = vpbroadcastd_avx512vl();
        uVar14 = vpcmpd_avx512vl(local_2e0,local_240,5);
        local_724 = (uint)bVar64;
        bVar64 = (byte)uVar14 & bVar64;
        _local_340 = vaddps_avx512vl(local_320,_local_380);
        _local_2c0 = _local_360;
        for (; auVar85 = _local_8e0, bVar64 != 0; bVar64 = ~bVar63 & bVar64 & (byte)uVar14) {
          auVar139._8_4_ = 0x7f800000;
          auVar139._0_8_ = 0x7f8000007f800000;
          auVar139._12_4_ = 0x7f800000;
          auVar139._16_4_ = 0x7f800000;
          auVar139._20_4_ = 0x7f800000;
          auVar139._24_4_ = 0x7f800000;
          auVar139._28_4_ = 0x7f800000;
          auVar84 = vblendmps_avx512vl(auVar139,local_320);
          auVar118._0_4_ =
               (uint)(bVar64 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar64 & 1) * 0x7f800000;
          bVar67 = (bool)(bVar64 >> 1 & 1);
          auVar118._4_4_ = (uint)bVar67 * auVar84._4_4_ | (uint)!bVar67 * 0x7f800000;
          bVar67 = (bool)(bVar64 >> 2 & 1);
          auVar118._8_4_ = (uint)bVar67 * auVar84._8_4_ | (uint)!bVar67 * 0x7f800000;
          bVar67 = (bool)(bVar64 >> 3 & 1);
          auVar118._12_4_ = (uint)bVar67 * auVar84._12_4_ | (uint)!bVar67 * 0x7f800000;
          bVar67 = (bool)(bVar64 >> 4 & 1);
          auVar118._16_4_ = (uint)bVar67 * auVar84._16_4_ | (uint)!bVar67 * 0x7f800000;
          bVar67 = (bool)(bVar64 >> 5 & 1);
          auVar118._20_4_ = (uint)bVar67 * auVar84._20_4_ | (uint)!bVar67 * 0x7f800000;
          bVar67 = (bool)(bVar64 >> 6 & 1);
          auVar118._24_4_ = (uint)bVar67 * auVar84._24_4_ | (uint)!bVar67 * 0x7f800000;
          auVar118._28_4_ =
               (uint)(bVar64 >> 7) * auVar84._28_4_ | (uint)!(bool)(bVar64 >> 7) * 0x7f800000;
          auVar84 = vshufps_avx(auVar118,auVar118,0xb1);
          auVar84 = vminps_avx(auVar118,auVar84);
          auVar86 = vshufpd_avx(auVar84,auVar84,5);
          auVar84 = vminps_avx(auVar84,auVar86);
          auVar86 = vpermpd_avx2(auVar84,0x4e);
          auVar84 = vminps_avx(auVar84,auVar86);
          uVar14 = vcmpps_avx512vl(auVar118,auVar84,0);
          bVar61 = (byte)uVar14 & bVar64;
          bVar63 = bVar64;
          if (bVar61 != 0) {
            bVar63 = bVar61;
          }
          iVar17 = 0;
          for (uVar71 = (uint)bVar63; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
            iVar17 = iVar17 + 1;
          }
          bVar63 = '\x01' << ((byte)iVar17 & 0x1f);
          aVar1 = (ray->dir).field_0;
          local_580._0_16_ = (undefined1  [16])aVar1;
          auVar74 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
          if (auVar74._0_4_ < 0.0) {
            local_8e0[1] = 0;
            local_8e0[0] = bVar64;
            stack0xfffffffffffff722 = auVar85._2_30_;
            local_900._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar17 << 2)));
            local_5c0._0_16_ = ZEXT416(*(uint *)(local_280 + (uint)(iVar17 << 2)));
            fVar141 = sqrtf(auVar74._0_4_);
            bVar64 = local_8e0[0];
            auVar241 = ZEXT3264(local_8c0);
            auVar240 = ZEXT3264(local_8a0);
            auVar237 = ZEXT3264(local_880);
            auVar235 = ZEXT3264(local_860);
            auVar234 = ZEXT3264(local_840);
            auVar233 = ZEXT3264(local_820);
            auVar232 = ZEXT3264(local_800);
            auVar231 = ZEXT3264(local_7e0);
            auVar230 = ZEXT3264(local_7c0);
            auVar229 = ZEXT3264(local_7a0);
            auVar242 = ZEXT3264(local_780);
            auVar238 = ZEXT3264(local_760);
            auVar239 = ZEXT3264(local_6c0);
            auVar236 = ZEXT3264(local_720);
            auVar74 = local_900._0_16_;
            auVar75 = local_5c0._0_16_;
          }
          else {
            auVar74 = vsqrtss_avx(auVar74,auVar74);
            fVar141 = auVar74._0_4_;
            auVar74 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar17 << 2)));
            auVar75 = ZEXT416(*(uint *)(local_280 + (uint)(iVar17 << 2)));
          }
          uVar70 = (ulong)bVar63;
          auVar76 = vminps_avx(local_440._0_16_,local_480._0_16_);
          auVar77 = vmaxps_avx(local_440._0_16_,local_480._0_16_);
          auVar72 = vminps_avx(local_460._0_16_,local_4a0._0_16_);
          auVar78 = vminps_avx(auVar76,auVar72);
          auVar76 = vmaxps_avx(local_460._0_16_,local_4a0._0_16_);
          auVar72 = vmaxps_avx(auVar77,auVar76);
          auVar179._8_4_ = 0x7fffffff;
          auVar179._0_8_ = 0x7fffffff7fffffff;
          auVar179._12_4_ = 0x7fffffff;
          auVar77 = vandps_avx(auVar78,auVar179);
          auVar76 = vandps_avx(auVar72,auVar179);
          auVar77 = vmaxps_avx(auVar77,auVar76);
          auVar76 = vmovshdup_avx(auVar77);
          auVar76 = vmaxss_avx(auVar76,auVar77);
          auVar77 = vshufpd_avx(auVar77,auVar77,1);
          auVar77 = vmaxss_avx(auVar77,auVar76);
          local_690 = auVar77._0_4_ * 1.9073486e-06;
          local_510 = vshufps_avx(auVar72,auVar72,0xff);
          auVar74 = vinsertps_avx(auVar75,auVar74,0x10);
          uVar65 = 0;
          while( true ) {
            bVar61 = (byte)uVar70;
            if (uVar65 == 5) break;
            uVar128 = auVar74._0_4_;
            auVar130._4_4_ = uVar128;
            auVar130._0_4_ = uVar128;
            auVar130._8_4_ = uVar128;
            auVar130._12_4_ = uVar128;
            auVar77 = vfmadd132ps_fma(auVar130,ZEXT816(0) << 0x40,local_580._0_16_);
            auVar75 = vmovshdup_avx(auVar74);
            local_3e0._0_16_ = auVar75;
            fVar153 = 1.0 - auVar75._0_4_;
            auVar75 = vshufps_avx(auVar74,auVar74,0x55);
            fVar127 = auVar75._0_4_;
            auVar158._0_4_ = local_480._0_4_ * fVar127;
            fVar151 = auVar75._4_4_;
            auVar158._4_4_ = local_480._4_4_ * fVar151;
            fVar152 = auVar75._8_4_;
            auVar158._8_4_ = local_480._8_4_ * fVar152;
            fVar154 = auVar75._12_4_;
            auVar158._12_4_ = local_480._12_4_ * fVar154;
            _local_3c0 = ZEXT416((uint)fVar153);
            auVar180._4_4_ = fVar153;
            auVar180._0_4_ = fVar153;
            auVar180._8_4_ = fVar153;
            auVar180._12_4_ = fVar153;
            auVar75 = vfmadd231ps_fma(auVar158,auVar180,local_440._0_16_);
            auVar194._0_4_ = local_460._0_4_ * fVar127;
            auVar194._4_4_ = local_460._4_4_ * fVar151;
            auVar194._8_4_ = local_460._8_4_ * fVar152;
            auVar194._12_4_ = local_460._12_4_ * fVar154;
            auVar76 = vfmadd231ps_fma(auVar194,auVar180,local_480._0_16_);
            auVar204._0_4_ = fVar127 * (float)local_4a0._0_4_;
            auVar204._4_4_ = fVar151 * (float)local_4a0._4_4_;
            auVar204._8_4_ = fVar152 * fStack_498;
            auVar204._12_4_ = fVar154 * fStack_494;
            auVar72 = vfmadd231ps_fma(auVar204,auVar180,local_460._0_16_);
            auVar210._0_4_ = fVar127 * auVar76._0_4_;
            auVar210._4_4_ = fVar151 * auVar76._4_4_;
            auVar210._8_4_ = fVar152 * auVar76._8_4_;
            auVar210._12_4_ = fVar154 * auVar76._12_4_;
            auVar75 = vfmadd231ps_fma(auVar210,auVar180,auVar75);
            auVar159._0_4_ = fVar127 * auVar72._0_4_;
            auVar159._4_4_ = fVar151 * auVar72._4_4_;
            auVar159._8_4_ = fVar152 * auVar72._8_4_;
            auVar159._12_4_ = fVar154 * auVar72._12_4_;
            auVar76 = vfmadd231ps_fma(auVar159,auVar180,auVar76);
            auVar195._0_4_ = fVar127 * auVar76._0_4_;
            auVar195._4_4_ = fVar151 * auVar76._4_4_;
            auVar195._8_4_ = fVar152 * auVar76._8_4_;
            auVar195._12_4_ = fVar154 * auVar76._12_4_;
            auVar72 = vfmadd231ps_fma(auVar195,auVar75,auVar180);
            auVar75 = vsubps_avx(auVar76,auVar75);
            auVar19._8_4_ = 0x40400000;
            auVar19._0_8_ = 0x4040000040400000;
            auVar19._12_4_ = 0x40400000;
            auVar76 = vmulps_avx512vl(auVar75,auVar19);
            local_3a0._0_16_ = auVar72;
            auVar75 = vsubps_avx(auVar77,auVar72);
            local_900._0_16_ = auVar75;
            auVar75 = vdpps_avx(auVar75,auVar75,0x7f);
            _local_8e0 = auVar76;
            local_5c0._0_16_ = auVar75;
            local_540._0_16_ = auVar74;
            if (auVar75._0_4_ < 0.0) {
              auVar218._0_4_ = sqrtf(auVar75._0_4_);
              auVar218._4_60_ = extraout_var;
              auVar74 = auVar218._0_16_;
              uVar70 = extraout_RAX;
              auVar76 = _local_8e0;
            }
            else {
              auVar74 = vsqrtss_avx(auVar75,auVar75);
            }
            local_400._0_16_ = vdpps_avx(auVar76,auVar76,0x7f);
            fVar151 = local_400._0_4_;
            auVar160._4_12_ = ZEXT812(0) << 0x20;
            auVar160._0_4_ = fVar151;
            local_5a0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar160);
            fVar127 = local_5a0._0_4_ * 1.5;
            local_420._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar160);
            auVar20._8_4_ = 0x80000000;
            auVar20._0_8_ = 0x8000000080000000;
            auVar20._12_4_ = 0x80000000;
            auVar77 = vxorps_avx512vl(local_400._0_16_,auVar20);
            auVar75 = vfnmadd213ss_fma(local_420._0_16_,local_400._0_16_,ZEXT416(0x40000000));
            local_560._0_4_ = auVar74._0_4_;
            if (fVar151 < auVar77._0_4_) {
              local_740._0_4_ = fVar127;
              fVar152 = sqrtf(fVar151);
              auVar74 = ZEXT416((uint)local_560._0_4_);
              uVar70 = extraout_RAX_00;
              auVar76 = _local_8e0;
            }
            else {
              auVar77 = vsqrtss_avx(local_400._0_16_,local_400._0_16_);
              fVar152 = auVar77._0_4_;
              local_740._0_4_ = fVar127;
            }
            fVar127 = local_5a0._0_4_;
            fVar127 = (float)local_740._0_4_ + fVar151 * -0.5 * fVar127 * fVar127 * fVar127;
            local_740._0_4_ = auVar76._0_4_ * fVar127;
            local_740._4_4_ = auVar76._4_4_ * fVar127;
            local_740._8_4_ = auVar76._8_4_ * fVar127;
            local_740._12_4_ = auVar76._12_4_ * fVar127;
            local_5a0._0_16_ = vdpps_avx(local_900._0_16_,local_740,0x7f);
            fVar154 = auVar74._0_4_;
            auVar131._0_4_ = local_5a0._0_4_ * local_5a0._0_4_;
            auVar131._4_4_ = local_5a0._4_4_ * local_5a0._4_4_;
            auVar131._8_4_ = local_5a0._8_4_ * local_5a0._8_4_;
            auVar131._12_4_ = local_5a0._12_4_ * local_5a0._12_4_;
            auVar77 = vsubps_avx(local_5c0._0_16_,auVar131);
            fVar151 = auVar77._0_4_;
            auVar142._4_12_ = ZEXT812(0) << 0x20;
            auVar142._0_4_ = fVar151;
            auVar72 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar142);
            auVar78 = vmulss_avx512f(auVar72,ZEXT416(0x3fc00000));
            auVar73 = vmulss_avx512f(auVar77,ZEXT416(0xbf000000));
            if (fVar151 < 0.0) {
              local_4f0._0_4_ = auVar78._0_4_;
              local_500._4_4_ = fVar127;
              local_500._0_4_ = fVar127;
              fStack_4f8 = fVar127;
              fStack_4f4 = fVar127;
              local_4e0 = auVar72;
              fVar151 = sqrtf(fVar151);
              auVar73 = ZEXT416(auVar73._0_4_);
              auVar78 = ZEXT416((uint)local_4f0._0_4_);
              auVar74 = ZEXT416((uint)local_560._0_4_);
              uVar70 = extraout_RAX_01;
              auVar72 = local_4e0;
              auVar76 = _local_8e0;
              fVar127 = (float)local_500._0_4_;
              fVar153 = (float)local_500._4_4_;
              fVar155 = fStack_4f8;
              fVar156 = fStack_4f4;
            }
            else {
              auVar77 = vsqrtss_avx(auVar77,auVar77);
              fVar151 = auVar77._0_4_;
              fVar153 = fVar127;
              fVar155 = fVar127;
              fVar156 = fVar127;
            }
            auVar236 = ZEXT3264(local_720);
            auVar239 = ZEXT3264(local_6c0);
            auVar238 = ZEXT3264(local_760);
            auVar242 = ZEXT3264(local_780);
            auVar229 = ZEXT3264(local_7a0);
            auVar230 = ZEXT3264(local_7c0);
            auVar231 = ZEXT3264(local_7e0);
            auVar232 = ZEXT3264(local_800);
            auVar233 = ZEXT3264(local_820);
            auVar234 = ZEXT3264(local_840);
            auVar235 = ZEXT3264(local_860);
            auVar237 = ZEXT3264(local_880);
            auVar240 = ZEXT3264(local_8a0);
            auVar241 = ZEXT3264(local_8c0);
            auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_3c0,local_3e0._0_16_);
            auVar77 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_3e0._0_16_,_local_3c0);
            fVar157 = auVar77._0_4_ * 6.0;
            fVar13 = local_3e0._0_4_ * 6.0;
            auVar181._0_4_ = fVar13 * (float)local_4a0._0_4_;
            auVar181._4_4_ = fVar13 * (float)local_4a0._4_4_;
            auVar181._8_4_ = fVar13 * fStack_498;
            auVar181._12_4_ = fVar13 * fStack_494;
            auVar161._4_4_ = fVar157;
            auVar161._0_4_ = fVar157;
            auVar161._8_4_ = fVar157;
            auVar161._12_4_ = fVar157;
            auVar77 = vfmadd132ps_fma(auVar161,auVar181,local_460._0_16_);
            fVar157 = auVar3._0_4_ * 6.0;
            auVar143._4_4_ = fVar157;
            auVar143._0_4_ = fVar157;
            auVar143._8_4_ = fVar157;
            auVar143._12_4_ = fVar157;
            auVar77 = vfmadd132ps_fma(auVar143,auVar77,local_480._0_16_);
            fVar157 = local_3c0._0_4_ * 6.0;
            auVar162._4_4_ = fVar157;
            auVar162._0_4_ = fVar157;
            auVar162._8_4_ = fVar157;
            auVar162._12_4_ = fVar157;
            auVar77 = vfmadd132ps_fma(auVar162,auVar77,local_440._0_16_);
            auVar144._0_4_ = auVar77._0_4_ * (float)local_400._0_4_;
            auVar144._4_4_ = auVar77._4_4_ * (float)local_400._0_4_;
            auVar144._8_4_ = auVar77._8_4_ * (float)local_400._0_4_;
            auVar144._12_4_ = auVar77._12_4_ * (float)local_400._0_4_;
            auVar77 = vdpps_avx(auVar76,auVar77,0x7f);
            fVar157 = auVar77._0_4_;
            auVar163._0_4_ = auVar76._0_4_ * fVar157;
            auVar163._4_4_ = auVar76._4_4_ * fVar157;
            auVar163._8_4_ = auVar76._8_4_ * fVar157;
            auVar163._12_4_ = auVar76._12_4_ * fVar157;
            auVar77 = vsubps_avx(auVar144,auVar163);
            fVar157 = auVar75._0_4_ * (float)local_420._0_4_;
            auVar3 = vmaxss_avx(ZEXT416((uint)local_690),
                                ZEXT416((uint)(local_540._0_4_ * fVar141 * 1.9073486e-06)));
            auVar21._8_4_ = 0x80000000;
            auVar21._0_8_ = 0x8000000080000000;
            auVar21._12_4_ = 0x80000000;
            auVar79 = vxorps_avx512vl(auVar76,auVar21);
            auVar164._0_4_ = fVar127 * auVar77._0_4_ * fVar157;
            auVar164._4_4_ = fVar153 * auVar77._4_4_ * fVar157;
            auVar164._8_4_ = fVar155 * auVar77._8_4_ * fVar157;
            auVar164._12_4_ = fVar156 * auVar77._12_4_ * fVar157;
            auVar75 = vdpps_avx(auVar79,local_740,0x7f);
            auVar77 = vfmadd213ss_fma(auVar74,ZEXT416((uint)local_690),auVar3);
            auVar74 = vdpps_avx(local_900._0_16_,auVar164,0x7f);
            auVar80 = vfmadd213ss_fma(ZEXT416((uint)(fVar154 + 1.0)),
                                      ZEXT416((uint)(local_690 / fVar152)),auVar77);
            fVar127 = auVar75._0_4_ + auVar74._0_4_;
            auVar74 = vdpps_avx(local_580._0_16_,local_740,0x7f);
            auVar75 = vdpps_avx(local_900._0_16_,auVar79,0x7f);
            auVar77 = vmulss_avx512f(auVar73,auVar72);
            auVar72 = vmulss_avx512f(auVar72,auVar72);
            auVar78 = vaddss_avx512f(auVar78,ZEXT416((uint)(auVar77._0_4_ * auVar72._0_4_)));
            auVar77 = vdpps_avx(local_900._0_16_,local_580._0_16_,0x7f);
            auVar73 = vfnmadd231ss_avx512f(auVar75,local_5a0._0_16_,ZEXT416((uint)fVar127));
            auVar77 = vfnmadd231ss_avx512f(auVar77,local_5a0._0_16_,auVar74);
            auVar75 = vpermilps_avx(local_3a0._0_16_,0xff);
            fVar151 = fVar151 - auVar75._0_4_;
            auVar72 = vshufps_avx(auVar76,auVar76,0xff);
            auVar75 = vfmsub213ss_fma(auVar73,auVar78,auVar72);
            auVar214._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
            auVar214._8_4_ = auVar75._8_4_ ^ 0x80000000;
            auVar214._12_4_ = auVar75._12_4_ ^ 0x80000000;
            auVar77 = ZEXT416((uint)(auVar77._0_4_ * auVar78._0_4_));
            auVar78 = vfmsub231ss_fma(ZEXT416((uint)(auVar74._0_4_ * auVar75._0_4_)),
                                      ZEXT416((uint)fVar127),auVar77);
            auVar75 = vinsertps_avx(auVar214,auVar77,0x1c);
            auVar205._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
            auVar205._8_4_ = auVar74._8_4_ ^ 0x80000000;
            auVar205._12_4_ = auVar74._12_4_ ^ 0x80000000;
            auVar77 = vinsertps_avx(ZEXT416((uint)fVar127),auVar205,0x10);
            auVar182._0_4_ = auVar78._0_4_;
            auVar182._4_4_ = auVar182._0_4_;
            auVar182._8_4_ = auVar182._0_4_;
            auVar182._12_4_ = auVar182._0_4_;
            auVar74 = vdivps_avx(auVar75,auVar182);
            auVar75 = vdivps_avx(auVar77,auVar182);
            auVar77 = vbroadcastss_avx512vl(local_5a0._0_16_);
            auVar183._0_4_ = auVar77._0_4_ * auVar74._0_4_ + fVar151 * auVar75._0_4_;
            auVar183._4_4_ = auVar77._4_4_ * auVar74._4_4_ + fVar151 * auVar75._4_4_;
            auVar183._8_4_ = auVar77._8_4_ * auVar74._8_4_ + fVar151 * auVar75._8_4_;
            auVar183._12_4_ = auVar77._12_4_ * auVar74._12_4_ + fVar151 * auVar75._12_4_;
            auVar74 = vsubps_avx(local_540._0_16_,auVar183);
            auVar22._8_4_ = 0x7fffffff;
            auVar22._0_8_ = 0x7fffffff7fffffff;
            auVar22._12_4_ = 0x7fffffff;
            auVar75 = vandps_avx512vl(local_5a0._0_16_,auVar22);
            if (auVar75._0_4_ < auVar80._0_4_) {
              auVar75 = vfmadd231ss_fma(ZEXT416((uint)(auVar80._0_4_ + auVar3._0_4_)),local_510,
                                        ZEXT416(0x36000000));
              auVar23._8_4_ = 0x7fffffff;
              auVar23._0_8_ = 0x7fffffff7fffffff;
              auVar23._12_4_ = 0x7fffffff;
              auVar77 = vandps_avx512vl(ZEXT416((uint)fVar151),auVar23);
              if (auVar77._0_4_ < auVar75._0_4_) {
                bVar67 = uVar65 < 5;
                fVar141 = auVar74._0_4_ + (float)local_520._0_4_;
                bVar61 = 0;
                if ((fVar141 < (ray->org).field_0.m128[3]) || (ray->tfar < fVar141))
                goto LAB_01a71cc3;
                auVar74 = vmovshdup_avx(auVar74);
                fVar127 = auVar74._0_4_;
                bVar61 = 0;
                if ((fVar127 < 0.0) || (bVar61 = 0, 1.0 < fVar127)) goto LAB_01a71cc3;
                auVar74 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_5c0._0_4_));
                fVar151 = auVar74._0_4_;
                pGVar4 = (context->scene->geometries).items[local_908].ptr;
                if ((pGVar4->mask & ray->mask) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar61 = 1, pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_01a71cc3;
                  local_8e0._0_4_ = ray->tfar;
                  fVar151 = fVar151 * 1.5 + local_5c0._0_4_ * -0.5 * fVar151 * fVar151 * fVar151;
                  auVar184._0_4_ = local_900._0_4_ * fVar151;
                  auVar184._4_4_ = local_900._4_4_ * fVar151;
                  auVar184._8_4_ = local_900._8_4_ * fVar151;
                  auVar184._12_4_ = local_900._12_4_ * fVar151;
                  auVar72 = vfmadd213ps_fma(auVar72,auVar184,auVar76);
                  auVar74 = vshufps_avx(auVar184,auVar184,0xc9);
                  auVar75 = vshufps_avx(auVar76,auVar76,0xc9);
                  auVar185._0_4_ = auVar184._0_4_ * auVar75._0_4_;
                  auVar185._4_4_ = auVar184._4_4_ * auVar75._4_4_;
                  auVar185._8_4_ = auVar184._8_4_ * auVar75._8_4_;
                  auVar185._12_4_ = auVar184._12_4_ * auVar75._12_4_;
                  auVar77 = vfmsub231ps_fma(auVar185,auVar76,auVar74);
                  auVar74 = vshufps_avx(auVar77,auVar77,0xc9);
                  auVar75 = vshufps_avx(auVar72,auVar72,0xc9);
                  auVar77 = vshufps_avx(auVar77,auVar77,0xd2);
                  auVar132._0_4_ = auVar72._0_4_ * auVar77._0_4_;
                  auVar132._4_4_ = auVar72._4_4_ * auVar77._4_4_;
                  auVar132._8_4_ = auVar72._8_4_ * auVar77._8_4_;
                  auVar132._12_4_ = auVar72._12_4_ * auVar77._12_4_;
                  auVar75 = vfmsub231ps_fma(auVar132,auVar74,auVar75);
                  auVar74 = vshufps_avx(auVar75,auVar75,0xe9);
                  local_680 = vmovlps_avx(auVar74);
                  local_678 = auVar75._0_4_;
                  local_670 = 0;
                  local_66c = (undefined4)local_910;
                  local_668 = (undefined4)local_908;
                  local_664 = context->user->instID[0];
                  local_660 = context->user->instPrimID[0];
                  ray->tfar = fVar141;
                  local_914 = -1;
                  local_6f0.valid = &local_914;
                  local_6f0.geometryUserPtr = pGVar4->userPtr;
                  local_6f0.context = context->user;
                  local_6f0.hit = (RTCHitN *)&local_680;
                  local_6f0.N = 1;
                  local_900._0_8_ = pGVar4;
                  local_6f0.ray = (RTCRayN *)ray;
                  local_674 = fVar127;
                  if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01a71f27:
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(local_900._0_8_ + 0x3e) & 0x40) != 0)))) {
                      (*p_Var5)(&local_6f0);
                      auVar241 = ZEXT3264(local_8c0);
                      auVar240 = ZEXT3264(local_8a0);
                      auVar237 = ZEXT3264(local_880);
                      auVar235 = ZEXT3264(local_860);
                      auVar234 = ZEXT3264(local_840);
                      auVar233 = ZEXT3264(local_820);
                      auVar232 = ZEXT3264(local_800);
                      auVar231 = ZEXT3264(local_7e0);
                      auVar230 = ZEXT3264(local_7c0);
                      auVar229 = ZEXT3264(local_7a0);
                      auVar242 = ZEXT3264(local_780);
                      auVar238 = ZEXT3264(local_760);
                      auVar239 = ZEXT3264(local_6c0);
                      auVar236 = ZEXT3264(local_720);
                      if (*local_6f0.valid == 0) goto LAB_01a71fe3;
                    }
                    bVar61 = 1;
                    goto LAB_01a71cc3;
                  }
                  (*pGVar4->occlusionFilterN)(&local_6f0);
                  auVar241 = ZEXT3264(local_8c0);
                  auVar240 = ZEXT3264(local_8a0);
                  auVar237 = ZEXT3264(local_880);
                  auVar235 = ZEXT3264(local_860);
                  auVar234 = ZEXT3264(local_840);
                  auVar233 = ZEXT3264(local_820);
                  auVar232 = ZEXT3264(local_800);
                  auVar231 = ZEXT3264(local_7e0);
                  auVar230 = ZEXT3264(local_7c0);
                  auVar229 = ZEXT3264(local_7a0);
                  auVar242 = ZEXT3264(local_780);
                  auVar238 = ZEXT3264(local_760);
                  auVar239 = ZEXT3264(local_6c0);
                  auVar236 = ZEXT3264(local_720);
                  if (*local_6f0.valid != 0) goto LAB_01a71f27;
LAB_01a71fe3:
                  ray->tfar = (float)local_8e0._0_4_;
                }
                bVar61 = 0;
                goto LAB_01a71cc3;
              }
            }
            uVar65 = uVar65 + 1;
          }
          bVar67 = false;
LAB_01a71cc3:
          bVar66 = bVar66 | bVar67 & bVar61;
          fVar141 = ray->tfar;
          auVar38._4_4_ = fVar141;
          auVar38._0_4_ = fVar141;
          auVar38._8_4_ = fVar141;
          auVar38._12_4_ = fVar141;
          auVar38._16_4_ = fVar141;
          auVar38._20_4_ = fVar141;
          auVar38._24_4_ = fVar141;
          auVar38._28_4_ = fVar141;
          uVar14 = vcmpps_avx512vl(_local_340,auVar38,2);
        }
        auVar149._0_4_ = (float)local_380._0_4_ + (float)local_360._0_4_;
        auVar149._4_4_ = (float)local_380._4_4_ + (float)local_360._4_4_;
        auVar149._8_4_ = fStack_378 + fStack_358;
        auVar149._12_4_ = fStack_374 + fStack_354;
        auVar149._16_4_ = fStack_370 + fStack_350;
        auVar149._20_4_ = fStack_36c + fStack_34c;
        auVar149._24_4_ = fStack_368 + fStack_348;
        auVar149._28_4_ = fStack_364 + fStack_344;
        fVar127 = ray->tfar;
        fVar141 = ray->tfar;
        auVar39._4_4_ = fVar141;
        auVar39._0_4_ = fVar141;
        auVar39._8_4_ = fVar141;
        auVar39._12_4_ = fVar141;
        auVar39._16_4_ = fVar141;
        auVar39._20_4_ = fVar141;
        auVar39._24_4_ = fVar141;
        auVar39._28_4_ = fVar141;
        uVar14 = vcmpps_avx512vl(auVar149,auVar39,2);
        auVar150._8_4_ = 2;
        auVar150._0_8_ = 0x200000002;
        auVar150._12_4_ = 2;
        auVar150._16_4_ = 2;
        auVar150._20_4_ = 2;
        auVar150._24_4_ = 2;
        auVar150._28_4_ = 2;
        auVar40._8_4_ = 3;
        auVar40._0_8_ = 0x300000003;
        auVar40._12_4_ = 3;
        auVar40._16_4_ = 3;
        auVar40._20_4_ = 3;
        auVar40._24_4_ = 3;
        auVar40._28_4_ = 3;
        auVar85 = vpblendmd_avx512vl(auVar150,auVar40);
        bVar67 = (bool)((byte)local_728 & 1);
        local_360._0_4_ = (uint)bVar67 * auVar85._0_4_ | (uint)!bVar67 * 2;
        bVar67 = (bool)((byte)(local_728 >> 1) & 1);
        local_360._4_4_ = (uint)bVar67 * auVar85._4_4_ | (uint)!bVar67 * 2;
        bVar67 = (bool)((byte)(local_728 >> 2) & 1);
        fStack_358 = (float)((uint)bVar67 * auVar85._8_4_ | (uint)!bVar67 * 2);
        bVar67 = (bool)((byte)(local_728 >> 3) & 1);
        fStack_354 = (float)((uint)bVar67 * auVar85._12_4_ | (uint)!bVar67 * 2);
        bVar67 = (bool)((byte)(local_728 >> 4) & 1);
        fStack_350 = (float)((uint)bVar67 * auVar85._16_4_ | (uint)!bVar67 * 2);
        bVar67 = (bool)((byte)(local_728 >> 5) & 1);
        fStack_34c = (float)((uint)bVar67 * auVar85._20_4_ | (uint)!bVar67 * 2);
        bVar67 = (bool)((byte)(local_728 >> 6) & 1);
        fStack_348 = (float)((uint)bVar67 * auVar85._24_4_ | (uint)!bVar67 * 2);
        bVar67 = (bool)((byte)(local_728 >> 7) & 1);
        fStack_344 = (float)((uint)bVar67 * auVar85._28_4_ | (uint)!bVar67 * 2);
        bVar60 = (byte)uVar15 & bVar60 & (byte)uVar14;
        uVar14 = vpcmpd_avx512vl(_local_360,local_2e0,2);
        local_320 = _local_2c0;
        local_340._4_4_ = (float)local_380._4_4_ + (float)local_2c0._4_4_;
        local_340._0_4_ = (float)local_380._0_4_ + (float)local_2c0._0_4_;
        fStack_338 = fStack_378 + fStack_2b8;
        fStack_334 = fStack_374 + fStack_2b4;
        fStack_330 = fStack_370 + fStack_2b0;
        fStack_32c = fStack_36c + fStack_2ac;
        fStack_328 = fStack_368 + fStack_2a8;
        fStack_324 = fStack_364 + fStack_2a4;
        auVar225 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar221 = ZEXT3264(local_5e0);
        auVar223 = ZEXT3264(local_600);
        auVar218 = ZEXT3264(local_620);
        auVar213 = ZEXT3264(local_640);
        for (bVar63 = (byte)uVar14 & bVar60; auVar85 = _local_8e0, bVar63 != 0;
            bVar63 = ~bVar64 & bVar63 & (byte)uVar14) {
          auVar140._8_4_ = 0x7f800000;
          auVar140._0_8_ = 0x7f8000007f800000;
          auVar140._12_4_ = 0x7f800000;
          auVar140._16_4_ = 0x7f800000;
          auVar140._20_4_ = 0x7f800000;
          auVar140._24_4_ = 0x7f800000;
          auVar140._28_4_ = 0x7f800000;
          auVar84 = vblendmps_avx512vl(auVar140,local_320);
          auVar119._0_4_ =
               (uint)(bVar63 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar63 & 1) * 0x7f800000;
          bVar67 = (bool)(bVar63 >> 1 & 1);
          auVar119._4_4_ = (uint)bVar67 * auVar84._4_4_ | (uint)!bVar67 * 0x7f800000;
          bVar67 = (bool)(bVar63 >> 2 & 1);
          auVar119._8_4_ = (uint)bVar67 * auVar84._8_4_ | (uint)!bVar67 * 0x7f800000;
          bVar67 = (bool)(bVar63 >> 3 & 1);
          auVar119._12_4_ = (uint)bVar67 * auVar84._12_4_ | (uint)!bVar67 * 0x7f800000;
          bVar67 = (bool)(bVar63 >> 4 & 1);
          auVar119._16_4_ = (uint)bVar67 * auVar84._16_4_ | (uint)!bVar67 * 0x7f800000;
          bVar67 = (bool)(bVar63 >> 5 & 1);
          auVar119._20_4_ = (uint)bVar67 * auVar84._20_4_ | (uint)!bVar67 * 0x7f800000;
          bVar67 = (bool)(bVar63 >> 6 & 1);
          auVar119._24_4_ = (uint)bVar67 * auVar84._24_4_ | (uint)!bVar67 * 0x7f800000;
          auVar119._28_4_ =
               (uint)(bVar63 >> 7) * auVar84._28_4_ | (uint)!(bool)(bVar63 >> 7) * 0x7f800000;
          auVar84 = vshufps_avx(auVar119,auVar119,0xb1);
          auVar84 = vminps_avx(auVar119,auVar84);
          auVar86 = vshufpd_avx(auVar84,auVar84,5);
          auVar84 = vminps_avx(auVar84,auVar86);
          auVar86 = vpermpd_avx2(auVar84,0x4e);
          auVar84 = vminps_avx(auVar84,auVar86);
          uVar14 = vcmpps_avx512vl(auVar119,auVar84,0);
          bVar61 = (byte)uVar14 & bVar63;
          bVar64 = bVar63;
          if (bVar61 != 0) {
            bVar64 = bVar61;
          }
          iVar17 = 0;
          for (uVar71 = (uint)bVar64; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
            iVar17 = iVar17 + 1;
          }
          bVar64 = '\x01' << ((byte)iVar17 & 0x1f);
          aVar1 = (ray->dir).field_0;
          local_5c0._0_16_ = (undefined1  [16])aVar1;
          auVar74 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
          if (auVar74._0_4_ < 0.0) {
            local_8e0[1] = 0;
            local_8e0[0] = bVar63;
            stack0xfffffffffffff722 = auVar85._2_30_;
            local_900._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar17 << 2)));
            local_580._0_16_ = ZEXT416(*(uint *)(local_2a0 + (uint)(iVar17 << 2)));
            fVar141 = sqrtf(auVar74._0_4_);
            bVar63 = local_8e0[0];
            auVar241 = ZEXT3264(local_8c0);
            auVar240 = ZEXT3264(local_8a0);
            auVar237 = ZEXT3264(local_880);
            auVar235 = ZEXT3264(local_860);
            auVar234 = ZEXT3264(local_840);
            auVar233 = ZEXT3264(local_820);
            auVar232 = ZEXT3264(local_800);
            auVar231 = ZEXT3264(local_7e0);
            auVar230 = ZEXT3264(local_7c0);
            auVar229 = ZEXT3264(local_7a0);
            auVar213 = ZEXT3264(local_640);
            auVar242 = ZEXT3264(local_780);
            auVar218 = ZEXT3264(local_620);
            auVar223 = ZEXT3264(local_600);
            auVar221 = ZEXT3264(local_5e0);
            auVar238 = ZEXT3264(local_760);
            auVar239 = ZEXT3264(local_6c0);
            auVar236 = ZEXT3264(local_720);
            auVar225 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
            auVar74 = local_900._0_16_;
            auVar75 = local_580._0_16_;
          }
          else {
            auVar74 = vsqrtss_avx(auVar74,auVar74);
            fVar141 = auVar74._0_4_;
            auVar74 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar17 << 2)));
            auVar75 = ZEXT416(*(uint *)(local_2a0 + (uint)(iVar17 << 2)));
          }
          uVar70 = (ulong)bVar64;
          auVar76 = vminps_avx(local_440._0_16_,local_480._0_16_);
          auVar77 = vmaxps_avx(local_440._0_16_,local_480._0_16_);
          auVar72 = vminps_avx(local_460._0_16_,local_4a0._0_16_);
          auVar78 = vminps_avx(auVar76,auVar72);
          auVar76 = vmaxps_avx(local_460._0_16_,local_4a0._0_16_);
          auVar72 = vmaxps_avx(auVar77,auVar76);
          auVar186._8_4_ = 0x7fffffff;
          auVar186._0_8_ = 0x7fffffff7fffffff;
          auVar186._12_4_ = 0x7fffffff;
          auVar77 = vandps_avx(auVar78,auVar186);
          auVar76 = vandps_avx(auVar72,auVar186);
          auVar77 = vmaxps_avx(auVar77,auVar76);
          auVar76 = vmovshdup_avx(auVar77);
          auVar76 = vmaxss_avx(auVar76,auVar77);
          auVar77 = vshufpd_avx(auVar77,auVar77,1);
          auVar77 = vmaxss_avx(auVar77,auVar76);
          fVar127 = auVar77._0_4_ * 1.9073486e-06;
          local_510 = vshufps_avx(auVar72,auVar72,0xff);
          auVar74 = vinsertps_avx(auVar75,auVar74,0x10);
          uVar65 = 0;
          while( true ) {
            bVar61 = (byte)uVar70;
            if (uVar65 == 5) break;
            uVar128 = auVar74._0_4_;
            auVar133._4_4_ = uVar128;
            auVar133._0_4_ = uVar128;
            auVar133._8_4_ = uVar128;
            auVar133._12_4_ = uVar128;
            auVar77 = vfmadd132ps_fma(auVar133,ZEXT816(0) << 0x40,local_5c0._0_16_);
            auVar75 = vmovshdup_avx(auVar74);
            local_3e0._0_16_ = auVar75;
            fVar155 = 1.0 - auVar75._0_4_;
            auVar75 = vshufps_avx(auVar74,auVar74,0x55);
            fVar151 = auVar75._0_4_;
            auVar165._0_4_ = local_480._0_4_ * fVar151;
            fVar152 = auVar75._4_4_;
            auVar165._4_4_ = local_480._4_4_ * fVar152;
            fVar154 = auVar75._8_4_;
            auVar165._8_4_ = local_480._8_4_ * fVar154;
            fVar153 = auVar75._12_4_;
            auVar165._12_4_ = local_480._12_4_ * fVar153;
            _local_3c0 = ZEXT416((uint)fVar155);
            auVar187._4_4_ = fVar155;
            auVar187._0_4_ = fVar155;
            auVar187._8_4_ = fVar155;
            auVar187._12_4_ = fVar155;
            auVar75 = vfmadd231ps_fma(auVar165,auVar187,local_440._0_16_);
            auVar196._0_4_ = local_460._0_4_ * fVar151;
            auVar196._4_4_ = local_460._4_4_ * fVar152;
            auVar196._8_4_ = local_460._8_4_ * fVar154;
            auVar196._12_4_ = local_460._12_4_ * fVar153;
            auVar76 = vfmadd231ps_fma(auVar196,auVar187,local_480._0_16_);
            auVar206._0_4_ = fVar151 * (float)local_4a0._0_4_;
            auVar206._4_4_ = fVar152 * (float)local_4a0._4_4_;
            auVar206._8_4_ = fVar154 * fStack_498;
            auVar206._12_4_ = fVar153 * fStack_494;
            auVar72 = vfmadd231ps_fma(auVar206,auVar187,local_460._0_16_);
            auVar211._0_4_ = fVar151 * auVar76._0_4_;
            auVar211._4_4_ = fVar152 * auVar76._4_4_;
            auVar211._8_4_ = fVar154 * auVar76._8_4_;
            auVar211._12_4_ = fVar153 * auVar76._12_4_;
            auVar75 = vfmadd231ps_fma(auVar211,auVar187,auVar75);
            auVar166._0_4_ = fVar151 * auVar72._0_4_;
            auVar166._4_4_ = fVar152 * auVar72._4_4_;
            auVar166._8_4_ = fVar154 * auVar72._8_4_;
            auVar166._12_4_ = fVar153 * auVar72._12_4_;
            auVar76 = vfmadd231ps_fma(auVar166,auVar187,auVar76);
            auVar197._0_4_ = fVar151 * auVar76._0_4_;
            auVar197._4_4_ = fVar152 * auVar76._4_4_;
            auVar197._8_4_ = fVar154 * auVar76._8_4_;
            auVar197._12_4_ = fVar153 * auVar76._12_4_;
            auVar72 = vfmadd231ps_fma(auVar197,auVar75,auVar187);
            auVar75 = vsubps_avx(auVar76,auVar75);
            auVar24._8_4_ = 0x40400000;
            auVar24._0_8_ = 0x4040000040400000;
            auVar24._12_4_ = 0x40400000;
            auVar76 = vmulps_avx512vl(auVar75,auVar24);
            local_3a0._0_16_ = auVar72;
            auVar75 = vsubps_avx(auVar77,auVar72);
            _local_8e0 = auVar75;
            auVar75 = vdpps_avx(auVar75,auVar75,0x7f);
            local_900._0_16_ = auVar76;
            local_580._0_16_ = auVar75;
            local_540._0_16_ = auVar74;
            if (auVar75._0_4_ < 0.0) {
              auVar221._0_4_ = sqrtf(auVar75._0_4_);
              auVar221._4_60_ = extraout_var_00;
              auVar74 = auVar221._0_16_;
              uVar70 = extraout_RAX_02;
              auVar76 = local_900._0_16_;
            }
            else {
              auVar74 = vsqrtss_avx(auVar75,auVar75);
            }
            local_400._0_16_ = vdpps_avx(auVar76,auVar76,0x7f);
            fVar152 = local_400._0_4_;
            auVar167._4_12_ = ZEXT812(0) << 0x20;
            auVar167._0_4_ = fVar152;
            local_5a0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar167);
            fVar151 = local_5a0._0_4_ * 1.5;
            local_690 = fVar152 * -0.5;
            local_420._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar167);
            auVar25._8_4_ = 0x80000000;
            auVar25._0_8_ = 0x8000000080000000;
            auVar25._12_4_ = 0x80000000;
            auVar77 = vxorps_avx512vl(local_400._0_16_,auVar25);
            auVar75 = vfnmadd213ss_fma(local_420._0_16_,local_400._0_16_,ZEXT416(0x40000000));
            local_560._0_4_ = auVar74._0_4_;
            if (fVar152 < auVar77._0_4_) {
              local_740._0_4_ = fVar151;
              fVar152 = sqrtf(fVar152);
              auVar74 = ZEXT416((uint)local_560._0_4_);
              uVar70 = extraout_RAX_03;
              fVar151 = (float)local_740._0_4_;
              auVar76 = local_900._0_16_;
            }
            else {
              auVar77 = vsqrtss_avx(local_400._0_16_,local_400._0_16_);
              fVar152 = auVar77._0_4_;
            }
            fVar154 = local_5a0._0_4_;
            local_690 = fVar151 + local_690 * fVar154 * fVar154 * fVar154;
            auVar226._0_4_ = auVar76._0_4_ * local_690;
            auVar226._4_4_ = auVar76._4_4_ * local_690;
            auVar226._8_4_ = auVar76._8_4_ * local_690;
            auVar226._12_4_ = auVar76._12_4_ * local_690;
            local_5a0._0_16_ = vdpps_avx(auVar226,_local_8e0,0x7f);
            auVar78 = vaddss_avx512f(auVar74,ZEXT416(0x3f800000));
            auVar134._0_4_ = local_5a0._0_4_ * local_5a0._0_4_;
            auVar134._4_4_ = local_5a0._4_4_ * local_5a0._4_4_;
            auVar134._8_4_ = local_5a0._8_4_ * local_5a0._8_4_;
            auVar134._12_4_ = local_5a0._12_4_ * local_5a0._12_4_;
            auVar77 = vsubps_avx(local_580._0_16_,auVar134);
            fVar151 = auVar77._0_4_;
            auVar145._4_12_ = ZEXT812(0) << 0x20;
            auVar145._0_4_ = fVar151;
            auVar72 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar145);
            auVar73 = vmulss_avx512f(auVar72,ZEXT416(0x3fc00000));
            local_740._0_4_ = fVar151 * -0.5;
            uVar69 = fVar151 == 0.0;
            uVar68 = fVar151 < 0.0;
            fStack_68c = local_690;
            fStack_688 = local_690;
            fStack_684 = local_690;
            if ((bool)uVar68) {
              local_4e0._0_4_ = fVar152;
              _local_500 = auVar226;
              local_4f0 = auVar72;
              fVar151 = sqrtf(fVar151);
              auVar73 = ZEXT416(auVar73._0_4_);
              auVar74 = ZEXT416((uint)local_560._0_4_);
              auVar78 = ZEXT416(auVar78._0_4_);
              uVar70 = extraout_RAX_04;
              auVar226 = _local_500;
              auVar72 = local_4f0;
              auVar76 = local_900._0_16_;
              fVar152 = (float)local_4e0._0_4_;
            }
            else {
              auVar77 = vsqrtss_avx(auVar77,auVar77);
              fVar151 = auVar77._0_4_;
            }
            auVar225 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
            auVar236 = ZEXT3264(local_720);
            auVar239 = ZEXT3264(local_6c0);
            auVar238 = ZEXT3264(local_760);
            auVar221 = ZEXT3264(local_5e0);
            auVar223 = ZEXT3264(local_600);
            auVar242 = ZEXT3264(local_780);
            auVar229 = ZEXT3264(local_7a0);
            auVar230 = ZEXT3264(local_7c0);
            auVar231 = ZEXT3264(local_7e0);
            auVar232 = ZEXT3264(local_800);
            auVar233 = ZEXT3264(local_820);
            auVar234 = ZEXT3264(local_840);
            auVar235 = ZEXT3264(local_860);
            auVar237 = ZEXT3264(local_880);
            auVar240 = ZEXT3264(local_8a0);
            auVar241 = ZEXT3264(local_8c0);
            auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_3c0,local_3e0._0_16_);
            auVar77 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_3e0._0_16_,_local_3c0);
            fVar154 = auVar77._0_4_ * 6.0;
            fVar153 = local_3e0._0_4_ * 6.0;
            auVar188._0_4_ = fVar153 * (float)local_4a0._0_4_;
            auVar188._4_4_ = fVar153 * (float)local_4a0._4_4_;
            auVar188._8_4_ = fVar153 * fStack_498;
            auVar188._12_4_ = fVar153 * fStack_494;
            auVar168._4_4_ = fVar154;
            auVar168._0_4_ = fVar154;
            auVar168._8_4_ = fVar154;
            auVar168._12_4_ = fVar154;
            auVar77 = vfmadd132ps_fma(auVar168,auVar188,local_460._0_16_);
            fVar154 = auVar3._0_4_ * 6.0;
            auVar146._4_4_ = fVar154;
            auVar146._0_4_ = fVar154;
            auVar146._8_4_ = fVar154;
            auVar146._12_4_ = fVar154;
            auVar77 = vfmadd132ps_fma(auVar146,auVar77,local_480._0_16_);
            fVar154 = local_3c0._0_4_ * 6.0;
            auVar169._4_4_ = fVar154;
            auVar169._0_4_ = fVar154;
            auVar169._8_4_ = fVar154;
            auVar169._12_4_ = fVar154;
            auVar77 = vfmadd132ps_fma(auVar169,auVar77,local_440._0_16_);
            auVar147._0_4_ = auVar77._0_4_ * (float)local_400._0_4_;
            auVar147._4_4_ = auVar77._4_4_ * (float)local_400._0_4_;
            auVar147._8_4_ = auVar77._8_4_ * (float)local_400._0_4_;
            auVar147._12_4_ = auVar77._12_4_ * (float)local_400._0_4_;
            auVar77 = vdpps_avx(auVar76,auVar77,0x7f);
            fVar154 = auVar77._0_4_;
            auVar170._0_4_ = auVar76._0_4_ * fVar154;
            auVar170._4_4_ = auVar76._4_4_ * fVar154;
            auVar170._8_4_ = auVar76._8_4_ * fVar154;
            auVar170._12_4_ = auVar76._12_4_ * fVar154;
            auVar77 = vsubps_avx(auVar147,auVar170);
            fVar154 = auVar75._0_4_ * (float)local_420._0_4_;
            auVar3 = vmaxss_avx(ZEXT416((uint)fVar127),
                                ZEXT416((uint)(local_540._0_4_ * fVar141 * 1.9073486e-06)));
            auVar26._8_4_ = 0x80000000;
            auVar26._0_8_ = 0x8000000080000000;
            auVar26._12_4_ = 0x80000000;
            auVar80 = vxorps_avx512vl(auVar76,auVar26);
            auVar171._0_4_ = auVar77._0_4_ * fVar154 * local_690;
            auVar171._4_4_ = auVar77._4_4_ * fVar154 * fStack_68c;
            auVar171._8_4_ = auVar77._8_4_ * fVar154 * fStack_688;
            auVar171._12_4_ = auVar77._12_4_ * fVar154 * fStack_684;
            auVar75 = vdpps_avx(auVar80,auVar226,0x7f);
            auVar77 = vfmadd213ss_fma(auVar74,ZEXT416((uint)fVar127),auVar3);
            auVar74 = vdpps_avx(_local_8e0,auVar171,0x7f);
            vfmadd213ss_avx512f(auVar78,ZEXT416((uint)(fVar127 / fVar152)),auVar77);
            fVar152 = auVar75._0_4_ + auVar74._0_4_;
            auVar74 = vdpps_avx(local_5c0._0_16_,auVar226,0x7f);
            auVar75 = vdpps_avx(_local_8e0,auVar80,0x7f);
            auVar77 = vmulss_avx512f(auVar72,ZEXT416((uint)local_740._0_4_));
            auVar72 = vmulss_avx512f(auVar72,auVar72);
            auVar78 = vaddss_avx512f(auVar73,ZEXT416((uint)(auVar77._0_4_ * auVar72._0_4_)));
            auVar77 = vdpps_avx(_local_8e0,local_5c0._0_16_,0x7f);
            auVar73 = vfnmadd231ss_avx512f(auVar75,local_5a0._0_16_,ZEXT416((uint)fVar152));
            auVar77 = vfnmadd231ss_avx512f(auVar77,local_5a0._0_16_,auVar74);
            auVar75 = vpermilps_avx(local_3a0._0_16_,0xff);
            fVar151 = fVar151 - auVar75._0_4_;
            auVar72 = vshufps_avx(auVar76,auVar76,0xff);
            auVar75 = vfmsub213ss_fma(auVar73,auVar78,auVar72);
            auVar215._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
            auVar215._8_4_ = auVar75._8_4_ ^ 0x80000000;
            auVar215._12_4_ = auVar75._12_4_ ^ 0x80000000;
            auVar77 = ZEXT416((uint)(auVar77._0_4_ * auVar78._0_4_));
            auVar78 = vfmsub231ss_fma(ZEXT416((uint)(auVar74._0_4_ * auVar75._0_4_)),
                                      ZEXT416((uint)fVar152),auVar77);
            auVar75 = vinsertps_avx(auVar215,auVar77,0x1c);
            auVar207._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
            auVar207._8_4_ = auVar74._8_4_ ^ 0x80000000;
            auVar207._12_4_ = auVar74._12_4_ ^ 0x80000000;
            auVar77 = vinsertps_avx(ZEXT416((uint)fVar152),auVar207,0x10);
            auVar189._0_4_ = auVar78._0_4_;
            auVar189._4_4_ = auVar189._0_4_;
            auVar189._8_4_ = auVar189._0_4_;
            auVar189._12_4_ = auVar189._0_4_;
            auVar74 = vdivps_avx(auVar75,auVar189);
            auVar75 = vdivps_avx(auVar77,auVar189);
            auVar77 = vbroadcastss_avx512vl(local_5a0._0_16_);
            auVar190._0_4_ = auVar77._0_4_ * auVar74._0_4_ + fVar151 * auVar75._0_4_;
            auVar190._4_4_ = auVar77._4_4_ * auVar74._4_4_ + fVar151 * auVar75._4_4_;
            auVar190._8_4_ = auVar77._8_4_ * auVar74._8_4_ + fVar151 * auVar75._8_4_;
            auVar190._12_4_ = auVar77._12_4_ * auVar74._12_4_ + fVar151 * auVar75._12_4_;
            auVar74 = vsubps_avx(local_540._0_16_,auVar190);
            auVar27._8_4_ = 0x7fffffff;
            auVar27._0_8_ = 0x7fffffff7fffffff;
            auVar27._12_4_ = 0x7fffffff;
            auVar75 = vandps_avx512vl(local_5a0._0_16_,auVar27);
            auVar75 = vucomiss_avx512f(auVar75);
            if (!(bool)uVar68 && !(bool)uVar69) {
              auVar75 = vaddss_avx512f(auVar3,auVar75);
              auVar75 = vfmadd231ss_fma(auVar75,local_510,ZEXT416(0x36000000));
              auVar28._8_4_ = 0x7fffffff;
              auVar28._0_8_ = 0x7fffffff7fffffff;
              auVar28._12_4_ = 0x7fffffff;
              auVar77 = vandps_avx512vl(ZEXT416((uint)fVar151),auVar28);
              if (auVar77._0_4_ < auVar75._0_4_) {
                bVar67 = uVar65 < 5;
                fVar141 = auVar74._0_4_ + (float)local_520._0_4_;
                auVar218 = ZEXT3264(local_620);
                auVar213 = ZEXT3264(local_640);
                bVar61 = 0;
                if ((fVar141 < (ray->org).field_0.m128[3]) || (ray->tfar < fVar141))
                goto LAB_01a72800;
                auVar74 = vmovshdup_avx(auVar74);
                fVar127 = auVar74._0_4_;
                bVar61 = 0;
                if ((fVar127 < 0.0) || (bVar61 = 0, 1.0 < fVar127)) goto LAB_01a72800;
                auVar74 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_580._0_4_));
                fVar151 = auVar74._0_4_;
                pGVar4 = (context->scene->geometries).items[local_908].ptr;
                if ((pGVar4->mask & ray->mask) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar61 = 1, pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_01a72800;
                  local_900._0_4_ = ray->tfar;
                  fVar151 = fVar151 * 1.5 +
                            (float)local_580._0_4_ * -0.5 * fVar151 * fVar151 * fVar151;
                  auVar191._0_4_ = fVar151 * (float)local_8e0._0_4_;
                  auVar191._4_4_ = fVar151 * (float)local_8e0._4_4_;
                  auVar191._8_4_ = fVar151 * fStack_8d8;
                  auVar191._12_4_ = fVar151 * fStack_8d4;
                  auVar72 = vfmadd213ps_fma(auVar72,auVar191,auVar76);
                  auVar74 = vshufps_avx(auVar191,auVar191,0xc9);
                  auVar75 = vshufps_avx(auVar76,auVar76,0xc9);
                  auVar192._0_4_ = auVar191._0_4_ * auVar75._0_4_;
                  auVar192._4_4_ = auVar191._4_4_ * auVar75._4_4_;
                  auVar192._8_4_ = auVar191._8_4_ * auVar75._8_4_;
                  auVar192._12_4_ = auVar191._12_4_ * auVar75._12_4_;
                  auVar77 = vfmsub231ps_fma(auVar192,auVar76,auVar74);
                  auVar74 = vshufps_avx(auVar77,auVar77,0xc9);
                  auVar75 = vshufps_avx(auVar72,auVar72,0xc9);
                  auVar77 = vshufps_avx(auVar77,auVar77,0xd2);
                  auVar135._0_4_ = auVar72._0_4_ * auVar77._0_4_;
                  auVar135._4_4_ = auVar72._4_4_ * auVar77._4_4_;
                  auVar135._8_4_ = auVar72._8_4_ * auVar77._8_4_;
                  auVar135._12_4_ = auVar72._12_4_ * auVar77._12_4_;
                  auVar75 = vfmsub231ps_fma(auVar135,auVar74,auVar75);
                  auVar74 = vshufps_avx(auVar75,auVar75,0xe9);
                  local_680 = vmovlps_avx(auVar74);
                  local_678 = auVar75._0_4_;
                  local_670 = 0;
                  local_66c = (undefined4)local_910;
                  local_668 = (undefined4)local_908;
                  local_664 = context->user->instID[0];
                  local_660 = context->user->instPrimID[0];
                  ray->tfar = fVar141;
                  local_914 = -1;
                  local_6f0.valid = &local_914;
                  local_6f0.geometryUserPtr = pGVar4->userPtr;
                  local_6f0.context = context->user;
                  local_6f0.hit = (RTCHitN *)&local_680;
                  local_6f0.N = 1;
                  local_8e0 = (undefined1  [8])pGVar4;
                  local_6f0.ray = (RTCRayN *)ray;
                  local_674 = fVar127;
                  if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01a72ab8:
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)((long)local_8e0 + 0x3e) & 0x40) != 0)))) {
                      (*p_Var5)(&local_6f0);
                      auVar241 = ZEXT3264(local_8c0);
                      auVar240 = ZEXT3264(local_8a0);
                      auVar237 = ZEXT3264(local_880);
                      auVar235 = ZEXT3264(local_860);
                      auVar234 = ZEXT3264(local_840);
                      auVar233 = ZEXT3264(local_820);
                      auVar232 = ZEXT3264(local_800);
                      auVar231 = ZEXT3264(local_7e0);
                      auVar230 = ZEXT3264(local_7c0);
                      auVar229 = ZEXT3264(local_7a0);
                      auVar213 = ZEXT3264(local_640);
                      auVar242 = ZEXT3264(local_780);
                      auVar218 = ZEXT3264(local_620);
                      auVar223 = ZEXT3264(local_600);
                      auVar221 = ZEXT3264(local_5e0);
                      auVar238 = ZEXT3264(local_760);
                      auVar239 = ZEXT3264(local_6c0);
                      auVar236 = ZEXT3264(local_720);
                      auVar225 = ZEXT3264(CONCAT428(0x3f800000,
                                                    CONCAT424(0x3f800000,
                                                              CONCAT420(0x3f800000,
                                                                        CONCAT416(0x3f800000,
                                                                                  CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                      if (*local_6f0.valid == 0) goto LAB_01a72ba1;
                    }
                    bVar61 = 1;
                    goto LAB_01a72800;
                  }
                  (*pGVar4->occlusionFilterN)(&local_6f0);
                  auVar241 = ZEXT3264(local_8c0);
                  auVar240 = ZEXT3264(local_8a0);
                  auVar237 = ZEXT3264(local_880);
                  auVar235 = ZEXT3264(local_860);
                  auVar234 = ZEXT3264(local_840);
                  auVar233 = ZEXT3264(local_820);
                  auVar232 = ZEXT3264(local_800);
                  auVar231 = ZEXT3264(local_7e0);
                  auVar230 = ZEXT3264(local_7c0);
                  auVar229 = ZEXT3264(local_7a0);
                  auVar213 = ZEXT3264(local_640);
                  auVar242 = ZEXT3264(local_780);
                  auVar218 = ZEXT3264(local_620);
                  auVar223 = ZEXT3264(local_600);
                  auVar221 = ZEXT3264(local_5e0);
                  auVar238 = ZEXT3264(local_760);
                  auVar239 = ZEXT3264(local_6c0);
                  auVar236 = ZEXT3264(local_720);
                  auVar225 = ZEXT3264(CONCAT428(0x3f800000,
                                                CONCAT424(0x3f800000,
                                                          CONCAT420(0x3f800000,
                                                                    CONCAT416(0x3f800000,
                                                                              CONCAT412(0x3f800000,
                                                                                        CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                  if (*local_6f0.valid != 0) goto LAB_01a72ab8;
LAB_01a72ba1:
                  ray->tfar = (float)local_900._0_4_;
                }
                bVar61 = 0;
                goto LAB_01a72800;
              }
            }
            uVar65 = uVar65 + 1;
            auVar218 = ZEXT3264(local_620);
            auVar213 = ZEXT3264(local_640);
          }
          bVar67 = false;
LAB_01a72800:
          bVar66 = bVar66 | bVar67 & bVar61;
          fVar127 = ray->tfar;
          fVar141 = ray->tfar;
          auVar41._4_4_ = fVar141;
          auVar41._0_4_ = fVar141;
          auVar41._8_4_ = fVar141;
          auVar41._12_4_ = fVar141;
          auVar41._16_4_ = fVar141;
          auVar41._20_4_ = fVar141;
          auVar41._24_4_ = fVar141;
          auVar41._28_4_ = fVar141;
          uVar14 = vcmpps_avx512vl(_local_340,auVar41,2);
        }
        uVar16 = vpcmpd_avx512vl(local_2e0,local_240,1);
        uVar15 = vpcmpd_avx512vl(local_2e0,_local_360,1);
        auVar177._0_4_ = (float)local_380._0_4_ + (float)local_280._0_4_;
        auVar177._4_4_ = (float)local_380._4_4_ + (float)local_280._4_4_;
        auVar177._8_4_ = fStack_378 + fStack_278;
        auVar177._12_4_ = fStack_374 + fStack_274;
        auVar177._16_4_ = fStack_370 + fStack_270;
        auVar177._20_4_ = fStack_36c + fStack_26c;
        auVar177._24_4_ = fStack_368 + fStack_268;
        auVar177._28_4_ = fStack_364 + fStack_264;
        auVar193._4_4_ = fVar127;
        auVar193._0_4_ = fVar127;
        auVar193._8_4_ = fVar127;
        auVar193._12_4_ = fVar127;
        auVar193._16_4_ = fVar127;
        auVar193._20_4_ = fVar127;
        auVar193._24_4_ = fVar127;
        auVar193._28_4_ = fVar127;
        uVar14 = vcmpps_avx512vl(auVar177,auVar193,2);
        bVar63 = (byte)local_724 & (byte)uVar16 & (byte)uVar14;
        auVar178._0_4_ = (float)local_380._0_4_ + (float)local_2c0._0_4_;
        auVar178._4_4_ = (float)local_380._4_4_ + (float)local_2c0._4_4_;
        auVar178._8_4_ = fStack_378 + fStack_2b8;
        auVar178._12_4_ = fStack_374 + fStack_2b4;
        auVar178._16_4_ = fStack_370 + fStack_2b0;
        auVar178._20_4_ = fStack_36c + fStack_2ac;
        auVar178._24_4_ = fStack_368 + fStack_2a8;
        auVar178._28_4_ = fStack_364 + fStack_2a4;
        uVar14 = vcmpps_avx512vl(auVar178,auVar193,2);
        bVar60 = bVar60 & (byte)uVar15 & (byte)uVar14 | bVar63;
        if (bVar60 != 0) {
          uVar65 = (ulong)uVar62;
          abStack_180[uVar65 * 0x60] = bVar60;
          bVar67 = (bool)(bVar63 >> 1 & 1);
          bVar6 = (bool)(bVar63 >> 2 & 1);
          bVar7 = (bool)(bVar63 >> 3 & 1);
          bVar8 = (bool)(bVar63 >> 4 & 1);
          bVar9 = (bool)(bVar63 >> 5 & 1);
          bVar10 = (bool)(bVar63 >> 6 & 1);
          auStack_160[uVar65 * 0x18] =
               (uint)(bVar63 & 1) * local_280._0_4_ | (uint)!(bool)(bVar63 & 1) * local_2c0._0_4_;
          auStack_160[uVar65 * 0x18 + 1] =
               (uint)bVar67 * local_280._4_4_ | (uint)!bVar67 * local_2c0._4_4_;
          auStack_160[uVar65 * 0x18 + 2] =
               (uint)bVar6 * (int)fStack_278 | (uint)!bVar6 * (int)fStack_2b8;
          auStack_160[uVar65 * 0x18 + 3] =
               (uint)bVar7 * (int)fStack_274 | (uint)!bVar7 * (int)fStack_2b4;
          auStack_160[uVar65 * 0x18 + 4] =
               (uint)bVar8 * (int)fStack_270 | (uint)!bVar8 * (int)fStack_2b0;
          auStack_160[uVar65 * 0x18 + 5] =
               (uint)bVar9 * (int)fStack_26c | (uint)!bVar9 * (int)fStack_2ac;
          auStack_160[uVar65 * 0x18 + 6] =
               (uint)bVar10 * (int)fStack_268 | (uint)!bVar10 * (int)fStack_2a8;
          auStack_160[uVar65 * 0x18 + 7] =
               (uint)(bVar63 >> 7) * (int)fStack_264 | (uint)!(bool)(bVar63 >> 7) * (int)fStack_2a4;
          uVar70 = vmovlps_avx(local_2f0);
          (&uStack_140)[uVar65 * 0xc] = uVar70;
          aiStack_138[uVar65 * 0x18] = local_928 + 1;
          uVar62 = uVar62 + 1;
        }
        auVar200 = ZEXT3264(local_4c0);
        prim = local_650;
      }
    }
    fVar141 = ray->tfar;
    auVar136._4_4_ = fVar141;
    auVar136._0_4_ = fVar141;
    auVar136._8_4_ = fVar141;
    auVar136._12_4_ = fVar141;
    auVar136._16_4_ = fVar141;
    auVar136._20_4_ = fVar141;
    auVar136._24_4_ = fVar141;
    auVar136._28_4_ = fVar141;
    do {
      uVar71 = uVar62;
      uVar120 = uVar71 - 1;
      if (uVar71 == 0) {
        if (bVar66 != 0) goto LAB_01a72d3b;
        uVar14 = vcmpps_avx512vl(auVar136,local_220,0xd);
        local_648 = (ulong)((uint)local_4c8 & (uint)uVar14);
        goto LAB_01a70649;
      }
      uVar70 = (ulong)uVar120;
      auVar85 = *(undefined1 (*) [32])(auStack_160 + uVar70 * 0x18);
      auVar175._0_4_ = auVar85._0_4_ + (float)local_380._0_4_;
      auVar175._4_4_ = auVar85._4_4_ + (float)local_380._4_4_;
      auVar175._8_4_ = auVar85._8_4_ + fStack_378;
      auVar175._12_4_ = auVar85._12_4_ + fStack_374;
      auVar175._16_4_ = auVar85._16_4_ + fStack_370;
      auVar175._20_4_ = auVar85._20_4_ + fStack_36c;
      auVar175._24_4_ = auVar85._24_4_ + fStack_368;
      auVar175._28_4_ = auVar85._28_4_ + fStack_364;
      uVar14 = vcmpps_avx512vl(auVar175,auVar136,2);
      uVar121 = (uint)uVar14 & (uint)abStack_180[uVar70 * 0x60];
      uVar62 = uVar120;
    } while (uVar121 == 0);
    uVar65 = (&uStack_140)[uVar70 * 0xc];
    auVar129._8_8_ = 0;
    auVar129._0_8_ = uVar65;
    auVar176._8_4_ = 0x7f800000;
    auVar176._0_8_ = 0x7f8000007f800000;
    auVar176._12_4_ = 0x7f800000;
    auVar176._16_4_ = 0x7f800000;
    auVar176._20_4_ = 0x7f800000;
    auVar176._24_4_ = 0x7f800000;
    auVar176._28_4_ = 0x7f800000;
    auVar84 = vblendmps_avx512vl(auVar176,auVar85);
    bVar60 = (byte)uVar121;
    auVar117._0_4_ =
         (uint)(bVar60 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar60 & 1) * (int)auVar85._0_4_;
    bVar67 = (bool)((byte)(uVar121 >> 1) & 1);
    auVar117._4_4_ = (uint)bVar67 * auVar84._4_4_ | (uint)!bVar67 * (int)auVar85._4_4_;
    bVar67 = (bool)((byte)(uVar121 >> 2) & 1);
    auVar117._8_4_ = (uint)bVar67 * auVar84._8_4_ | (uint)!bVar67 * (int)auVar85._8_4_;
    bVar67 = (bool)((byte)(uVar121 >> 3) & 1);
    auVar117._12_4_ = (uint)bVar67 * auVar84._12_4_ | (uint)!bVar67 * (int)auVar85._12_4_;
    bVar67 = (bool)((byte)(uVar121 >> 4) & 1);
    auVar117._16_4_ = (uint)bVar67 * auVar84._16_4_ | (uint)!bVar67 * (int)auVar85._16_4_;
    bVar67 = (bool)((byte)(uVar121 >> 5) & 1);
    auVar117._20_4_ = (uint)bVar67 * auVar84._20_4_ | (uint)!bVar67 * (int)auVar85._20_4_;
    bVar67 = (bool)((byte)(uVar121 >> 6) & 1);
    auVar117._24_4_ = (uint)bVar67 * auVar84._24_4_ | (uint)!bVar67 * (int)auVar85._24_4_;
    auVar117._28_4_ =
         (uVar121 >> 7) * auVar84._28_4_ | (uint)!SUB41(uVar121 >> 7,0) * (int)auVar85._28_4_;
    auVar85 = vshufps_avx(auVar117,auVar117,0xb1);
    auVar85 = vminps_avx(auVar117,auVar85);
    auVar84 = vshufpd_avx(auVar85,auVar85,5);
    auVar85 = vminps_avx(auVar85,auVar84);
    auVar84 = vpermpd_avx2(auVar85,0x4e);
    auVar85 = vminps_avx(auVar85,auVar84);
    uVar14 = vcmpps_avx512vl(auVar117,auVar85,0);
    bVar63 = (byte)uVar14 & bVar60;
    if (bVar63 != 0) {
      uVar121 = (uint)bVar63;
    }
    uVar122 = 0;
    for (; (uVar121 & 1) == 0; uVar121 = uVar121 >> 1 | 0x80000000) {
      uVar122 = uVar122 + 1;
    }
    local_928 = aiStack_138[uVar70 * 0x18];
    bVar60 = ~('\x01' << ((byte)uVar122 & 0x1f)) & bVar60;
    abStack_180[uVar70 * 0x60] = bVar60;
    uVar62 = uVar71;
    if (bVar60 == 0) {
      uVar62 = uVar120;
    }
    uVar128 = (undefined4)uVar65;
    auVar148._4_4_ = uVar128;
    auVar148._0_4_ = uVar128;
    auVar148._8_4_ = uVar128;
    auVar148._12_4_ = uVar128;
    auVar148._16_4_ = uVar128;
    auVar148._20_4_ = uVar128;
    auVar148._24_4_ = uVar128;
    auVar148._28_4_ = uVar128;
    auVar74 = vmovshdup_avx(auVar129);
    auVar74 = vsubps_avx(auVar74,auVar129);
    auVar137._0_4_ = auVar74._0_4_;
    auVar137._4_4_ = auVar137._0_4_;
    auVar137._8_4_ = auVar137._0_4_;
    auVar137._12_4_ = auVar137._0_4_;
    auVar137._16_4_ = auVar137._0_4_;
    auVar137._20_4_ = auVar137._0_4_;
    auVar137._24_4_ = auVar137._0_4_;
    auVar137._28_4_ = auVar137._0_4_;
    auVar74 = vfmadd132ps_fma(auVar137,auVar148,_DAT_01f7b040);
    _local_280 = ZEXT1632(auVar74);
    local_2f0._8_8_ = 0;
    local_2f0._0_8_ = *(ulong *)(local_280 + (ulong)uVar122 * 4);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }